

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  undefined8 uVar26;
  uint uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar75 [32];
  float fVar76;
  byte bVar77;
  ulong uVar78;
  uint uVar79;
  ulong uVar80;
  long lVar81;
  long lVar82;
  Geometry *pGVar83;
  long lVar84;
  uint uVar85;
  byte bVar86;
  ulong uVar87;
  float fVar88;
  float fVar89;
  float fVar146;
  float fVar148;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar97 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar98 [16];
  float fVar152;
  float fVar153;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined4 uVar166;
  undefined8 uVar167;
  undefined1 auVar168 [32];
  float fVar169;
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar176;
  undefined1 auVar175 [32];
  float fVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  RTCFilterFunctionNArguments local_660;
  undefined1 local_630 [16];
  Geometry *local_618;
  undefined1 (*local_610) [32];
  Precalculations *local_608;
  undefined1 local_600 [32];
  ulong local_5d8;
  LinearSpace3fa *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  
  uVar78 = (ulong)(byte)prim[1];
  lVar84 = uVar78 * 0x25;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar113 = vpmovsxbd_avx2(auVar91);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar110 = vpmovsxbd_avx2(auVar90);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar94);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar78 * 0xf + 6);
  auVar115 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar114 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar78 * 0x11 + 6);
  auVar111 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0x1a + 6);
  auVar112 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar78 * 0x1b + 6);
  auVar105 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar78 * 0x1c + 6);
  auVar106 = vpmovsxbd_avx2(auVar11);
  uVar166 = *(undefined4 *)(prim + lVar84 + 0x12);
  auVar214._4_4_ = uVar166;
  auVar214._0_4_ = uVar166;
  auVar214._8_4_ = uVar166;
  auVar214._12_4_ = uVar166;
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar90 = vsubps_avx512vl(auVar91,*(undefined1 (*) [16])(prim + lVar84 + 6));
  fVar170 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar84 + 0x16)) *
            *(float *)(prim + lVar84 + 0x1a);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xb + 6));
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xd + 6));
  auVar99 = vpbroadcastd_avx512vl();
  auVar91 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar91 = vinsertps_avx512f(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar90 = vmulps_avx512vl(auVar214,auVar90);
  auVar91 = vmulps_avx512vl(auVar214,auVar91);
  auVar100 = vcvtdq2ps_avx512vl(auVar113);
  auVar101 = vcvtdq2ps_avx512vl(auVar110);
  auVar102 = vcvtdq2ps_avx512vl(auVar116);
  auVar103 = vcvtdq2ps_avx512vl(auVar115);
  auVar104 = vcvtdq2ps_avx512vl(auVar114);
  auVar113 = vcvtdq2ps_avx(auVar111);
  auVar116 = vcvtdq2ps_avx(auVar112);
  auVar115 = vcvtdq2ps_avx(auVar105);
  auVar114 = vcvtdq2ps_avx(auVar106);
  uVar166 = auVar91._0_4_;
  auVar184._4_4_ = uVar166;
  auVar184._0_4_ = uVar166;
  auVar184._8_4_ = uVar166;
  auVar184._12_4_ = uVar166;
  auVar184._16_4_ = uVar166;
  auVar184._20_4_ = uVar166;
  auVar184._24_4_ = uVar166;
  auVar184._28_4_ = uVar166;
  auVar105 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar106 = vpermps_avx512vl(auVar105,ZEXT1632(auVar91));
  auVar107 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar108 = vpermps_avx512vl(auVar107,ZEXT1632(auVar91));
  auVar109 = vmulps_avx512vl(auVar108,auVar102);
  auVar111._4_4_ = auVar108._4_4_ * auVar113._4_4_;
  auVar111._0_4_ = auVar108._0_4_ * auVar113._0_4_;
  auVar111._8_4_ = auVar108._8_4_ * auVar113._8_4_;
  auVar111._12_4_ = auVar108._12_4_ * auVar113._12_4_;
  auVar111._16_4_ = auVar108._16_4_ * auVar113._16_4_;
  auVar111._20_4_ = auVar108._20_4_ * auVar113._20_4_;
  auVar111._24_4_ = auVar108._24_4_ * auVar113._24_4_;
  auVar111._28_4_ = auVar110._28_4_;
  auVar112._4_4_ = auVar114._4_4_ * auVar108._4_4_;
  auVar112._0_4_ = auVar114._0_4_ * auVar108._0_4_;
  auVar112._8_4_ = auVar114._8_4_ * auVar108._8_4_;
  auVar112._12_4_ = auVar114._12_4_ * auVar108._12_4_;
  auVar112._16_4_ = auVar114._16_4_ * auVar108._16_4_;
  auVar112._20_4_ = auVar114._20_4_ * auVar108._20_4_;
  auVar112._24_4_ = auVar114._24_4_ * auVar108._24_4_;
  auVar112._28_4_ = auVar108._28_4_;
  auVar110 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar101);
  auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,auVar104);
  auVar91 = vfmadd231ps_fma(auVar112,auVar115,auVar106);
  auVar110 = vfmadd231ps_avx512vl(auVar110,auVar184,auVar100);
  auVar111 = vfmadd231ps_avx512vl(auVar111,auVar184,auVar103);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar116,auVar184);
  auVar112 = vbroadcastss_avx512vl(auVar90);
  auVar105 = vpermps_avx512vl(auVar105,ZEXT1632(auVar90));
  auVar106 = vpermps_avx512vl(auVar107,ZEXT1632(auVar90));
  auVar102 = vmulps_avx512vl(auVar106,auVar102);
  auVar113 = vmulps_avx512vl(auVar106,auVar113);
  auVar114 = vmulps_avx512vl(auVar106,auVar114);
  auVar106 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar101);
  auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,auVar104);
  auVar115 = vfmadd231ps_avx512vl(auVar114,auVar105,auVar115);
  auVar114 = vfmadd231ps_avx512vl(auVar106,auVar112,auVar100);
  auVar100 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar103);
  auVar214 = vfmadd231ps_fma(auVar115,auVar112,auVar116);
  auVar107._8_4_ = 0x7fffffff;
  auVar107._0_8_ = 0x7fffffff7fffffff;
  auVar107._12_4_ = 0x7fffffff;
  auVar107._16_4_ = 0x7fffffff;
  auVar107._20_4_ = 0x7fffffff;
  auVar107._24_4_ = 0x7fffffff;
  auVar107._28_4_ = 0x7fffffff;
  auVar113 = vandps_avx(auVar107,auVar110);
  auVar104._8_4_ = 0x219392ef;
  auVar104._0_8_ = 0x219392ef219392ef;
  auVar104._12_4_ = 0x219392ef;
  auVar104._16_4_ = 0x219392ef;
  auVar104._20_4_ = 0x219392ef;
  auVar104._24_4_ = 0x219392ef;
  auVar104._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar113,auVar104,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar101._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._12_4_;
  bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
  auVar101._16_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._16_4_;
  bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
  auVar101._20_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._20_4_;
  bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
  auVar101._24_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._24_4_;
  bVar18 = SUB81(uVar80 >> 7,0);
  auVar101._28_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar110._28_4_;
  auVar113 = vandps_avx(auVar107,auVar111);
  uVar80 = vcmpps_avx512vl(auVar113,auVar104,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar102._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._12_4_;
  bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
  auVar102._16_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._16_4_;
  bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
  auVar102._20_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._20_4_;
  bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
  auVar102._24_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._24_4_;
  bVar18 = SUB81(uVar80 >> 7,0);
  auVar102._28_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar111._28_4_;
  auVar113 = vandps_avx(auVar107,ZEXT1632(auVar91));
  uVar80 = vcmpps_avx512vl(auVar113,auVar104,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar113._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar91._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar101);
  auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar217 = ZEXT3264(auVar115);
  auVar110 = vfnmadd213ps_avx512vl(auVar101,auVar116,auVar115);
  auVar91 = vfmadd132ps_fma(auVar110,auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar102);
  auVar110 = vfnmadd213ps_avx512vl(auVar102,auVar116,auVar115);
  auVar90 = vfmadd132ps_fma(auVar110,auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar113);
  auVar113 = vfnmadd213ps_avx512vl(auVar113,auVar116,auVar115);
  auVar94 = vfmadd132ps_fma(auVar113,auVar116,auVar116);
  auVar103._4_4_ = fVar170;
  auVar103._0_4_ = fVar170;
  auVar103._8_4_ = fVar170;
  auVar103._12_4_ = fVar170;
  auVar103._16_4_ = fVar170;
  auVar103._20_4_ = fVar170;
  auVar103._24_4_ = fVar170;
  auVar103._28_4_ = fVar170;
  auVar113 = vcvtdq2ps_avx(auVar117);
  auVar116 = vcvtdq2ps_avx(auVar118);
  auVar116 = vsubps_avx(auVar116,auVar113);
  auVar6 = vfmadd213ps_fma(auVar116,auVar103,auVar113);
  auVar113 = vcvtdq2ps_avx(auVar119);
  auVar116 = vcvtdq2ps_avx(auVar120);
  auVar116 = vsubps_avx(auVar116,auVar113);
  auVar7 = vfmadd213ps_fma(auVar116,auVar103,auVar113);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x12 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x16 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar113);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x14 + 6));
  auVar8 = vfmadd213ps_fma(auVar116,auVar103,auVar113);
  auVar113 = vcvtdq2ps_avx(auVar115);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x18 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar113);
  auVar9 = vfmadd213ps_fma(auVar116,auVar103,auVar113);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x1d + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x21 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar113);
  auVar10 = vfmadd213ps_fma(auVar116,auVar103,auVar113);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x1f + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x23 + 6));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar116 = vsubps_avx(auVar116,auVar113);
  auVar11 = vfmadd213ps_fma(auVar116,auVar103,auVar113);
  auVar113 = vsubps_avx(ZEXT1632(auVar6),auVar114);
  auVar105._4_4_ = auVar91._4_4_ * auVar113._4_4_;
  auVar105._0_4_ = auVar91._0_4_ * auVar113._0_4_;
  auVar105._8_4_ = auVar91._8_4_ * auVar113._8_4_;
  auVar105._12_4_ = auVar91._12_4_ * auVar113._12_4_;
  auVar105._16_4_ = auVar113._16_4_ * 0.0;
  auVar105._20_4_ = auVar113._20_4_ * 0.0;
  auVar105._24_4_ = auVar113._24_4_ * 0.0;
  auVar105._28_4_ = auVar113._28_4_;
  auVar113 = vsubps_avx(ZEXT1632(auVar7),auVar114);
  auVar120._0_4_ = auVar91._0_4_ * auVar113._0_4_;
  auVar120._4_4_ = auVar91._4_4_ * auVar113._4_4_;
  auVar120._8_4_ = auVar91._8_4_ * auVar113._8_4_;
  auVar120._12_4_ = auVar91._12_4_ * auVar113._12_4_;
  auVar120._16_4_ = auVar113._16_4_ * 0.0;
  auVar120._20_4_ = auVar113._20_4_ * 0.0;
  auVar120._24_4_ = auVar113._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar113 = vsubps_avx(ZEXT1632(auVar8),auVar100);
  auVar106._4_4_ = auVar90._4_4_ * auVar113._4_4_;
  auVar106._0_4_ = auVar90._0_4_ * auVar113._0_4_;
  auVar106._8_4_ = auVar90._8_4_ * auVar113._8_4_;
  auVar106._12_4_ = auVar90._12_4_ * auVar113._12_4_;
  auVar106._16_4_ = auVar113._16_4_ * 0.0;
  auVar106._20_4_ = auVar113._20_4_ * 0.0;
  auVar106._24_4_ = auVar113._24_4_ * 0.0;
  auVar106._28_4_ = auVar113._28_4_;
  auVar113 = vsubps_avx(ZEXT1632(auVar9),auVar100);
  auVar119._0_4_ = auVar90._0_4_ * auVar113._0_4_;
  auVar119._4_4_ = auVar90._4_4_ * auVar113._4_4_;
  auVar119._8_4_ = auVar90._8_4_ * auVar113._8_4_;
  auVar119._12_4_ = auVar90._12_4_ * auVar113._12_4_;
  auVar119._16_4_ = auVar113._16_4_ * 0.0;
  auVar119._20_4_ = auVar113._20_4_ * 0.0;
  auVar119._24_4_ = auVar113._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar113 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar214));
  auVar117._4_4_ = auVar94._4_4_ * auVar113._4_4_;
  auVar117._0_4_ = auVar94._0_4_ * auVar113._0_4_;
  auVar117._8_4_ = auVar94._8_4_ * auVar113._8_4_;
  auVar117._12_4_ = auVar94._12_4_ * auVar113._12_4_;
  auVar117._16_4_ = auVar113._16_4_ * 0.0;
  auVar117._20_4_ = auVar113._20_4_ * 0.0;
  auVar117._24_4_ = auVar113._24_4_ * 0.0;
  auVar117._28_4_ = auVar113._28_4_;
  auVar113 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar214));
  auVar118._0_4_ = auVar94._0_4_ * auVar113._0_4_;
  auVar118._4_4_ = auVar94._4_4_ * auVar113._4_4_;
  auVar118._8_4_ = auVar94._8_4_ * auVar113._8_4_;
  auVar118._12_4_ = auVar94._12_4_ * auVar113._12_4_;
  auVar118._16_4_ = auVar113._16_4_ * 0.0;
  auVar118._20_4_ = auVar113._20_4_ * 0.0;
  auVar118._24_4_ = auVar113._24_4_ * 0.0;
  auVar118._28_4_ = 0;
  auVar113 = vpminsd_avx2(auVar105,auVar120);
  auVar116 = vpminsd_avx2(auVar106,auVar119);
  auVar113 = vmaxps_avx(auVar113,auVar116);
  auVar116 = vpminsd_avx2(auVar117,auVar118);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar115._4_4_ = uVar166;
  auVar115._0_4_ = uVar166;
  auVar115._8_4_ = uVar166;
  auVar115._12_4_ = uVar166;
  auVar115._16_4_ = uVar166;
  auVar115._20_4_ = uVar166;
  auVar115._24_4_ = uVar166;
  auVar115._28_4_ = uVar166;
  auVar116 = vmaxps_avx512vl(auVar116,auVar115);
  auVar113 = vmaxps_avx(auVar113,auVar116);
  auVar116._8_4_ = 0x3f7ffffa;
  auVar116._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar116._12_4_ = 0x3f7ffffa;
  auVar116._16_4_ = 0x3f7ffffa;
  auVar116._20_4_ = 0x3f7ffffa;
  auVar116._24_4_ = 0x3f7ffffa;
  auVar116._28_4_ = 0x3f7ffffa;
  local_540 = vmulps_avx512vl(auVar113,auVar116);
  auVar218 = ZEXT3264(local_540);
  auVar113 = vpmaxsd_avx2(auVar105,auVar120);
  auVar116 = vpmaxsd_avx2(auVar106,auVar119);
  auVar113 = vminps_avx(auVar113,auVar116);
  auVar116 = vpmaxsd_avx2(auVar117,auVar118);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar114._4_4_ = uVar166;
  auVar114._0_4_ = uVar166;
  auVar114._8_4_ = uVar166;
  auVar114._12_4_ = uVar166;
  auVar114._16_4_ = uVar166;
  auVar114._20_4_ = uVar166;
  auVar114._24_4_ = uVar166;
  auVar114._28_4_ = uVar166;
  auVar116 = vminps_avx512vl(auVar116,auVar114);
  auVar113 = vminps_avx(auVar113,auVar116);
  auVar110._8_4_ = 0x3f800003;
  auVar110._0_8_ = 0x3f8000033f800003;
  auVar110._12_4_ = 0x3f800003;
  auVar110._16_4_ = 0x3f800003;
  auVar110._20_4_ = 0x3f800003;
  auVar110._24_4_ = 0x3f800003;
  auVar110._28_4_ = 0x3f800003;
  auVar113 = vmulps_avx512vl(auVar113,auVar110);
  uVar167 = vcmpps_avx512vl(local_540,auVar113,2);
  uVar26 = vpcmpgtd_avx512vl(auVar99,_DAT_01fb4ba0);
  local_5c8 = (ulong)(byte)((byte)uVar167 & (byte)uVar26);
  local_5d0 = pre->ray_space + k;
  local_610 = (undefined1 (*) [32])&local_140;
  local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar219 = ZEXT464(0xbf800000);
  local_608 = pre;
  do {
    if (local_5c8 == 0) {
      return;
    }
    lVar84 = 0;
    for (uVar80 = local_5c8; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      lVar84 = lVar84 + 1;
    }
    uVar12 = *(uint *)(prim + 2);
    uVar85 = *(uint *)(prim + lVar84 * 4 + 6);
    uVar80 = (ulong)uVar85;
    pGVar83 = (context->scene->geometries).items[uVar12].ptr;
    uVar78 = (ulong)*(uint *)(*(long *)&pGVar83->field_0x58 +
                             uVar80 * pGVar83[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar170 = (pGVar83->time_range).lower;
    fVar170 = pGVar83->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar170) / ((pGVar83->time_range).upper - fVar170))
    ;
    auVar91 = vroundss_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),9);
    auVar90 = vaddss_avx512f(ZEXT416((uint)pGVar83->fnumTimeSegments),auVar219._0_16_);
    auVar91 = vminss_avx(auVar91,auVar90);
    auVar91 = vmaxss_avx(ZEXT816(0) << 0x20,auVar91);
    fVar170 = fVar170 - auVar91._0_4_;
    _Var15 = pGVar83[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar82 = (long)(int)auVar91._0_4_ * 0x38;
    lVar84 = *(long *)(_Var15 + 0x10 + lVar82);
    lVar81 = *(long *)(_Var15 + 0x38 + lVar82);
    lVar16 = *(long *)(_Var15 + 0x48 + lVar82);
    auVar92._4_4_ = fVar170;
    auVar92._0_4_ = fVar170;
    auVar92._8_4_ = fVar170;
    auVar92._12_4_ = fVar170;
    pfVar3 = (float *)(lVar81 + uVar78 * lVar16);
    auVar93._0_4_ = fVar170 * *pfVar3;
    auVar93._4_4_ = fVar170 * pfVar3[1];
    auVar93._8_4_ = fVar170 * pfVar3[2];
    auVar93._12_4_ = fVar170 * pfVar3[3];
    pfVar3 = (float *)(lVar81 + (uVar78 + 1) * lVar16);
    auVar213._0_4_ = fVar170 * *pfVar3;
    auVar213._4_4_ = fVar170 * pfVar3[1];
    auVar213._8_4_ = fVar170 * pfVar3[2];
    auVar213._12_4_ = fVar170 * pfVar3[3];
    auVar91 = vmulps_avx512vl(auVar92,*(undefined1 (*) [16])(lVar81 + (uVar78 + 2) * lVar16));
    auVar90 = vmulps_avx512vl(auVar92,*(undefined1 (*) [16])(lVar81 + lVar16 * (uVar78 + 3)));
    lVar81 = *(long *)(_Var15 + lVar82);
    fVar170 = 1.0 - fVar170;
    auVar154._4_4_ = fVar170;
    auVar154._0_4_ = fVar170;
    auVar154._8_4_ = fVar170;
    auVar154._12_4_ = fVar170;
    auVar6 = vfmadd231ps_fma(auVar93,auVar154,*(undefined1 (*) [16])(lVar81 + lVar84 * uVar78));
    auVar7 = vfmadd231ps_fma(auVar213,auVar154,
                             *(undefined1 (*) [16])(lVar81 + lVar84 * (uVar78 + 1)));
    auVar92 = vfmadd231ps_avx512vl
                        (auVar91,auVar154,*(undefined1 (*) [16])(lVar81 + lVar84 * (uVar78 + 2)));
    auVar93 = vfmadd231ps_avx512vl
                        (auVar90,auVar154,*(undefined1 (*) [16])(lVar81 + lVar84 * (uVar78 + 3)));
    iVar13 = (int)pGVar83[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar94 = vsubps_avx(auVar6,auVar91);
    uVar166 = auVar94._0_4_;
    auVar95._4_4_ = uVar166;
    auVar95._0_4_ = uVar166;
    auVar95._8_4_ = uVar166;
    auVar95._12_4_ = uVar166;
    auVar90 = vshufps_avx(auVar94,auVar94,0x55);
    aVar4 = (local_5d0->vx).field_0;
    aVar5 = (local_5d0->vy).field_0;
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    fVar170 = (local_5d0->vz).field_0.m128[0];
    fVar67 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
    fVar68 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
    fVar69 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
    auVar205._0_4_ = fVar170 * auVar94._0_4_;
    auVar205._4_4_ = fVar67 * auVar94._4_4_;
    auVar205._8_4_ = fVar68 * auVar94._8_4_;
    auVar205._12_4_ = fVar69 * auVar94._12_4_;
    auVar90 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar90);
    auVar8 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar95);
    auVar94 = vsubps_avx(auVar7,auVar91);
    uVar166 = auVar94._0_4_;
    auVar96._4_4_ = uVar166;
    auVar96._0_4_ = uVar166;
    auVar96._8_4_ = uVar166;
    auVar96._12_4_ = uVar166;
    auVar90 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar208._0_4_ = fVar170 * auVar94._0_4_;
    auVar208._4_4_ = fVar67 * auVar94._4_4_;
    auVar208._8_4_ = fVar68 * auVar94._8_4_;
    auVar208._12_4_ = fVar69 * auVar94._12_4_;
    auVar90 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar90);
    auVar9 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar96);
    auVar94 = vsubps_avx512vl(auVar92,auVar91);
    uVar166 = auVar94._0_4_;
    auVar97._4_4_ = uVar166;
    auVar97._0_4_ = uVar166;
    auVar97._8_4_ = uVar166;
    auVar97._12_4_ = uVar166;
    auVar90 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar210._0_4_ = fVar170 * auVar94._0_4_;
    auVar210._4_4_ = fVar67 * auVar94._4_4_;
    auVar210._8_4_ = fVar68 * auVar94._8_4_;
    auVar210._12_4_ = fVar69 * auVar94._12_4_;
    auVar90 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar5,auVar90);
    auVar94 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar97);
    auVar90 = vsubps_avx512vl(auVar93,auVar91);
    uVar166 = auVar90._0_4_;
    auVar98._4_4_ = uVar166;
    auVar98._0_4_ = uVar166;
    auVar98._8_4_ = uVar166;
    auVar98._12_4_ = uVar166;
    auVar91 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar212._0_4_ = fVar170 * auVar90._0_4_;
    auVar212._4_4_ = fVar67 * auVar90._4_4_;
    auVar212._8_4_ = fVar68 * auVar90._8_4_;
    auVar212._12_4_ = fVar69 * auVar90._12_4_;
    auVar91 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar91);
    lVar84 = (long)iVar13 * 0x44;
    auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar84);
    auVar10 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar4,auVar98);
    uVar166 = auVar8._0_4_;
    local_440._4_4_ = uVar166;
    local_440._0_4_ = uVar166;
    local_440._8_4_ = uVar166;
    local_440._12_4_ = uVar166;
    local_440._16_4_ = uVar166;
    local_440._20_4_ = uVar166;
    local_440._24_4_ = uVar166;
    local_440._28_4_ = uVar166;
    auVar99._8_4_ = 1;
    auVar99._0_8_ = 0x100000001;
    auVar99._12_4_ = 1;
    auVar99._16_4_ = 1;
    auVar99._20_4_ = 1;
    auVar99._24_4_ = 1;
    auVar99._28_4_ = 1;
    local_460 = vpermps_avx2(auVar99,ZEXT1632(auVar8));
    auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 + 0x484);
    uVar166 = auVar9._0_4_;
    auVar178._4_4_ = uVar166;
    auVar178._0_4_ = uVar166;
    auVar178._8_4_ = uVar166;
    auVar178._12_4_ = uVar166;
    local_480._16_4_ = uVar166;
    local_480._0_16_ = auVar178;
    local_480._20_4_ = uVar166;
    local_480._24_4_ = uVar166;
    local_480._28_4_ = uVar166;
    local_4a0 = vpermps_avx512vl(auVar99,ZEXT1632(auVar9));
    auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 + 0x908);
    local_4c0 = vbroadcastss_avx512vl(auVar94);
    auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 + 0xd8c);
    local_4e0 = vpermps_avx512vl(auVar99,ZEXT1632(auVar94));
    uVar166 = auVar10._0_4_;
    local_500._4_4_ = uVar166;
    local_500._0_4_ = uVar166;
    fStack_4f8 = (float)uVar166;
    fStack_4f4 = (float)uVar166;
    fStack_4f0 = (float)uVar166;
    fStack_4ec = (float)uVar166;
    fStack_4e8 = (float)uVar166;
    register0x0000139c = uVar166;
    _local_520 = vpermps_avx512vl(auVar99,ZEXT1632(auVar10));
    auVar110 = vmulps_avx512vl(_local_500,auVar114);
    auVar111 = vmulps_avx512vl(_local_520,auVar114);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_4c0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_4e0);
    auVar91 = vfmadd231ps_fma(auVar110,auVar116,local_480);
    auVar106 = vfmadd231ps_avx512vl(auVar111,auVar116,local_4a0);
    auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar113,local_440);
    auVar200 = ZEXT3264(auVar117);
    auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar84);
    auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 + 0x484);
    auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 + 0x908);
    auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 + 0xd8c);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_460);
    auVar191 = ZEXT3264(auVar106);
    auVar118 = vmulps_avx512vl(_local_500,auVar105);
    auVar119 = vmulps_avx512vl(_local_520,auVar105);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar112,local_4c0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar112,local_4e0);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar111,local_480);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar111,local_4a0);
    auVar11 = vfmadd231ps_fma(auVar118,auVar110,local_440);
    auVar202 = ZEXT1664(auVar11);
    auVar214 = vfmadd231ps_fma(auVar119,auVar110,local_460);
    auVar118 = vsubps_avx512vl(ZEXT1632(auVar11),auVar117);
    auVar119 = vsubps_avx512vl(ZEXT1632(auVar214),auVar106);
    auVar120 = vmulps_avx512vl(auVar106,auVar118);
    auVar99 = vmulps_avx512vl(auVar117,auVar119);
    auVar120 = vsubps_avx512vl(auVar120,auVar99);
    auVar91 = vshufps_avx(auVar6,auVar6,0xff);
    uVar167 = auVar91._0_8_;
    local_80._8_8_ = uVar167;
    local_80._0_8_ = uVar167;
    local_80._16_8_ = uVar167;
    local_80._24_8_ = uVar167;
    auVar91 = vshufps_avx(auVar7,auVar7,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar91);
    auVar91 = vshufps_avx512vl(auVar92,auVar92,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar91);
    auVar91 = vshufps_avx512vl(auVar93,auVar93,0xff);
    uVar167 = auVar91._0_8_;
    local_e0._8_8_ = uVar167;
    local_e0._0_8_ = uVar167;
    local_e0._16_8_ = uVar167;
    local_e0._24_8_ = uVar167;
    auVar99 = vmulps_avx512vl(local_e0,auVar114);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar115,local_c0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar116,local_a0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar113,local_80);
    auVar100 = vmulps_avx512vl(local_e0,auVar105);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,local_c0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar111,local_a0);
    auVar154 = vfmadd231ps_fma(auVar100,auVar110,local_80);
    auVar100 = vmulps_avx512vl(auVar119,auVar119);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar118,auVar118);
    auVar101 = vmaxps_avx512vl(auVar99,ZEXT1632(auVar154));
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vmulps_avx512vl(auVar101,auVar100);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    uVar167 = vcmpps_avx512vl(auVar120,auVar100,2);
    auVar91 = vblendps_avx(auVar8,auVar6,8);
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar90 = vandps_avx512vl(auVar91,auVar95);
    auVar91 = vblendps_avx(auVar9,auVar7,8);
    auVar91 = vandps_avx512vl(auVar91,auVar95);
    auVar90 = vmaxps_avx(auVar90,auVar91);
    auVar91 = vblendps_avx(auVar94,auVar92,8);
    auVar96 = vandps_avx512vl(auVar91,auVar95);
    auVar91 = vblendps_avx(auVar10,auVar93,8);
    auVar91 = vandps_avx512vl(auVar91,auVar95);
    auVar91 = vmaxps_avx(auVar96,auVar91);
    auVar91 = vmaxps_avx(auVar90,auVar91);
    auVar90 = vmovshdup_avx(auVar91);
    auVar90 = vmaxss_avx(auVar90,auVar91);
    auVar91 = vshufpd_avx(auVar91,auVar91,1);
    auVar91 = vmaxss_avx(auVar91,auVar90);
    auVar90 = vcvtsi2ss_avx512f(auVar217._0_16_,iVar13);
    local_5c0._0_16_ = auVar90;
    auVar100._0_4_ = auVar90._0_4_;
    auVar100._4_4_ = auVar100._0_4_;
    auVar100._8_4_ = auVar100._0_4_;
    auVar100._12_4_ = auVar100._0_4_;
    auVar100._16_4_ = auVar100._0_4_;
    auVar100._20_4_ = auVar100._0_4_;
    auVar100._24_4_ = auVar100._0_4_;
    auVar100._28_4_ = auVar100._0_4_;
    uVar26 = vcmpps_avx512vl(auVar100,_DAT_01f7b060,0xe);
    bVar86 = (byte)uVar167 & (byte)uVar26;
    fVar170 = auVar91._0_4_ * 4.7683716e-07;
    local_630 = ZEXT416((uint)fVar170);
    auVar108._8_4_ = 2;
    auVar108._0_8_ = 0x200000002;
    auVar108._12_4_ = 2;
    auVar108._16_4_ = 2;
    auVar108._20_4_ = 2;
    auVar108._24_4_ = 2;
    auVar108._28_4_ = 2;
    local_240 = vpermps_avx2(auVar108,ZEXT1632(auVar8));
    local_260 = vpermps_avx2(auVar108,ZEXT1632(auVar9));
    local_280 = vpermps_avx2(auVar108,ZEXT1632(auVar94));
    local_2a0 = vpermps_avx2(auVar108,ZEXT1632(auVar10));
    local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
    uStack_55c = 0;
    uStack_558 = 0;
    uStack_554 = 0;
    local_2c0 = vpbroadcastd_avx512vl();
    local_2e0 = vpbroadcastd_avx512vl();
    local_670 = auVar6._0_8_;
    uStack_668 = auVar6._8_8_;
    local_680 = auVar7._0_8_;
    uStack_678 = auVar7._8_8_;
    local_690 = auVar92._0_8_;
    uStack_688 = auVar92._8_8_;
    local_6a0._0_4_ = auVar93._0_4_;
    fVar67 = (float)local_6a0;
    local_6a0._4_4_ = auVar93._4_4_;
    fVar68 = local_6a0._4_4_;
    uStack_698._0_4_ = auVar93._8_4_;
    fVar69 = (float)uStack_698;
    uStack_698._4_4_ = auVar93._12_4_;
    fVar76 = uStack_698._4_4_;
    local_6a0 = auVar93._0_8_;
    uStack_698 = auVar93._8_8_;
    if (bVar86 != 0) {
      auVar105 = vmulps_avx512vl(local_2a0,auVar105);
      auVar112 = vfmadd213ps_avx512vl(auVar112,local_280,auVar105);
      auVar111 = vfmadd213ps_avx512vl(auVar111,local_260,auVar112);
      auVar111 = vfmadd213ps_avx512vl(auVar110,local_240,auVar111);
      auVar114 = vmulps_avx512vl(local_2a0,auVar114);
      auVar115 = vfmadd213ps_avx512vl(auVar115,local_280,auVar114);
      auVar112 = vfmadd213ps_avx512vl(auVar116,local_260,auVar115);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 + 0x1210);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 + 0x1694);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 + 0x1b18);
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 + 0x1f9c);
      auVar112 = vfmadd213ps_avx512vl(auVar113,local_240,auVar112);
      auVar113 = vmulps_avx512vl(_local_500,auVar110);
      auVar105 = vmulps_avx512vl(_local_520,auVar110);
      auVar110 = vmulps_avx512vl(local_2a0,auVar110);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar114,local_4c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_4e0);
      auVar114 = vfmadd231ps_avx512vl(auVar110,local_280,auVar114);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_480);
      auVar110 = vfmadd231ps_avx512vl(auVar105,auVar115,local_4a0);
      auVar105 = vfmadd231ps_avx512vl(auVar114,local_260,auVar115);
      auVar91 = vfmadd231ps_fma(auVar113,auVar116,local_440);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar116,local_460);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 + 0x1210);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 + 0x1b18);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 + 0x1f9c);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_240,auVar116);
      auVar116 = vmulps_avx512vl(_local_500,auVar114);
      auVar120 = vmulps_avx512vl(_local_520,auVar114);
      auVar114 = vmulps_avx512vl(local_2a0,auVar114);
      auVar101 = vfmadd231ps_avx512vl(auVar116,auVar115,local_4c0);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,local_4e0);
      auVar115 = vfmadd231ps_avx512vl(auVar114,local_280,auVar115);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 + 0x1694);
      auVar114 = vfmadd231ps_avx512vl(auVar101,auVar116,local_480);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_4a0);
      auVar116 = vfmadd231ps_avx512vl(auVar115,local_260,auVar116);
      auVar90 = vfmadd231ps_fma(auVar114,auVar113,local_440);
      auVar115 = vfmadd231ps_avx512vl(auVar120,auVar113,local_460);
      auVar114 = vfmadd231ps_avx512vl(auVar116,local_240,auVar113);
      auVar219 = ZEXT1664(auVar219._0_16_);
      auVar218 = ZEXT3264(auVar218._0_32_);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar217 = ZEXT3264(auVar120);
      auVar215._8_4_ = 0x7fffffff;
      auVar215._0_8_ = 0x7fffffff7fffffff;
      auVar215._12_4_ = 0x7fffffff;
      auVar215._16_4_ = 0x7fffffff;
      auVar215._20_4_ = 0x7fffffff;
      auVar215._24_4_ = 0x7fffffff;
      auVar215._28_4_ = 0x7fffffff;
      auVar113 = vandps_avx(ZEXT1632(auVar91),auVar215);
      auVar116 = vandps_avx(auVar110,auVar215);
      auVar116 = vmaxps_avx(auVar113,auVar116);
      auVar113 = vandps_avx(auVar105,auVar215);
      auVar113 = vmaxps_avx(auVar116,auVar113);
      auVar211._4_4_ = fVar170;
      auVar211._0_4_ = fVar170;
      auVar211._8_4_ = fVar170;
      auVar211._12_4_ = fVar170;
      auVar211._16_4_ = fVar170;
      auVar211._20_4_ = fVar170;
      auVar211._24_4_ = fVar170;
      auVar211._28_4_ = fVar170;
      uVar78 = vcmpps_avx512vl(auVar113,auVar211,1);
      bVar18 = (bool)((byte)uVar78 & 1);
      auVar121._0_4_ = (float)((uint)bVar18 * auVar118._0_4_ | (uint)!bVar18 * auVar91._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar18 * auVar118._4_4_ | (uint)!bVar18 * auVar91._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar18 * auVar118._8_4_ | (uint)!bVar18 * auVar91._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar18 * auVar118._12_4_ | (uint)!bVar18 * auVar91._12_4_);
      fVar207 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar118._16_4_);
      auVar121._16_4_ = fVar207;
      fVar206 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar118._20_4_);
      auVar121._20_4_ = fVar206;
      fVar204 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar118._24_4_);
      auVar121._24_4_ = fVar204;
      uVar79 = (uint)(byte)(uVar78 >> 7) * auVar118._28_4_;
      auVar121._28_4_ = uVar79;
      bVar18 = (bool)((byte)uVar78 & 1);
      auVar122._0_4_ = (float)((uint)bVar18 * auVar119._0_4_ | (uint)!bVar18 * auVar110._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar122._4_4_ = (float)((uint)bVar18 * auVar119._4_4_ | (uint)!bVar18 * auVar110._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar122._8_4_ = (float)((uint)bVar18 * auVar119._8_4_ | (uint)!bVar18 * auVar110._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar122._12_4_ = (float)((uint)bVar18 * auVar119._12_4_ | (uint)!bVar18 * auVar110._12_4_);
      bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar122._16_4_ = (float)((uint)bVar18 * auVar119._16_4_ | (uint)!bVar18 * auVar110._16_4_);
      bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar122._20_4_ = (float)((uint)bVar18 * auVar119._20_4_ | (uint)!bVar18 * auVar110._20_4_);
      bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar122._24_4_ = (float)((uint)bVar18 * auVar119._24_4_ | (uint)!bVar18 * auVar110._24_4_);
      bVar18 = SUB81(uVar78 >> 7,0);
      auVar122._28_4_ = (uint)bVar18 * auVar119._28_4_ | (uint)!bVar18 * auVar110._28_4_;
      auVar113 = vandps_avx(auVar215,ZEXT1632(auVar90));
      auVar116 = vandps_avx(auVar115,auVar215);
      auVar116 = vmaxps_avx(auVar113,auVar116);
      auVar113 = vandps_avx(auVar114,auVar215);
      auVar113 = vmaxps_avx(auVar116,auVar113);
      uVar78 = vcmpps_avx512vl(auVar113,auVar211,1);
      bVar18 = (bool)((byte)uVar78 & 1);
      auVar123._0_4_ = (float)((uint)bVar18 * auVar118._0_4_ | (uint)!bVar18 * auVar90._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar18 * auVar118._4_4_ | (uint)!bVar18 * auVar90._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar18 * auVar118._8_4_ | (uint)!bVar18 * auVar90._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar18 * auVar118._12_4_ | (uint)!bVar18 * auVar90._12_4_);
      fVar176 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar118._16_4_);
      auVar123._16_4_ = fVar176;
      fVar169 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar118._20_4_);
      auVar123._20_4_ = fVar169;
      fVar177 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar118._24_4_);
      auVar123._24_4_ = fVar177;
      auVar123._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar118._28_4_;
      bVar18 = (bool)((byte)uVar78 & 1);
      auVar124._0_4_ = (float)((uint)bVar18 * auVar119._0_4_ | (uint)!bVar18 * auVar115._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar18 * auVar119._4_4_ | (uint)!bVar18 * auVar115._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar18 * auVar119._8_4_ | (uint)!bVar18 * auVar115._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar18 * auVar119._12_4_ | (uint)!bVar18 * auVar115._12_4_);
      bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar124._16_4_ = (float)((uint)bVar18 * auVar119._16_4_ | (uint)!bVar18 * auVar115._16_4_);
      bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar124._20_4_ = (float)((uint)bVar18 * auVar119._20_4_ | (uint)!bVar18 * auVar115._20_4_);
      bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar124._24_4_ = (float)((uint)bVar18 * auVar119._24_4_ | (uint)!bVar18 * auVar115._24_4_);
      bVar18 = SUB81(uVar78 >> 7,0);
      auVar124._28_4_ = (uint)bVar18 * auVar119._28_4_ | (uint)!bVar18 * auVar115._28_4_;
      auVar97 = vxorps_avx512vl(auVar178,auVar178);
      auVar113 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar97));
      auVar91 = vfmadd231ps_fma(auVar113,auVar122,auVar122);
      auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
      fVar88 = auVar113._0_4_;
      fVar89 = auVar113._4_4_;
      fVar146 = auVar113._8_4_;
      fVar147 = auVar113._12_4_;
      fVar148 = auVar113._16_4_;
      fVar149 = auVar113._20_4_;
      fVar150 = auVar113._24_4_;
      auVar109._4_4_ = fVar89 * fVar89 * fVar89 * auVar91._4_4_ * -0.5;
      auVar109._0_4_ = fVar88 * fVar88 * fVar88 * auVar91._0_4_ * -0.5;
      auVar109._8_4_ = fVar146 * fVar146 * fVar146 * auVar91._8_4_ * -0.5;
      auVar109._12_4_ = fVar147 * fVar147 * fVar147 * auVar91._12_4_ * -0.5;
      auVar109._16_4_ = fVar148 * fVar148 * fVar148 * -0.0;
      auVar109._20_4_ = fVar149 * fVar149 * fVar149 * -0.0;
      auVar109._24_4_ = fVar150 * fVar150 * fVar150 * -0.0;
      auVar109._28_4_ = 0;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar115 = vfmadd231ps_avx512vl(auVar109,auVar116,auVar113);
      auVar35._4_4_ = auVar122._4_4_ * auVar115._4_4_;
      auVar35._0_4_ = auVar122._0_4_ * auVar115._0_4_;
      auVar35._8_4_ = auVar122._8_4_ * auVar115._8_4_;
      auVar35._12_4_ = auVar122._12_4_ * auVar115._12_4_;
      auVar35._16_4_ = auVar122._16_4_ * auVar115._16_4_;
      auVar35._20_4_ = auVar122._20_4_ * auVar115._20_4_;
      auVar35._24_4_ = auVar122._24_4_ * auVar115._24_4_;
      auVar35._28_4_ = auVar113._28_4_;
      auVar36._4_4_ = auVar115._4_4_ * -auVar121._4_4_;
      auVar36._0_4_ = auVar115._0_4_ * -auVar121._0_4_;
      auVar36._8_4_ = auVar115._8_4_ * -auVar121._8_4_;
      auVar36._12_4_ = auVar115._12_4_ * -auVar121._12_4_;
      auVar36._16_4_ = auVar115._16_4_ * -fVar207;
      auVar36._20_4_ = auVar115._20_4_ * -fVar206;
      auVar36._24_4_ = auVar115._24_4_ * -fVar204;
      auVar36._28_4_ = uVar79 ^ 0x80000000;
      auVar113 = vmulps_avx512vl(auVar115,ZEXT1632(auVar97));
      auVar118 = ZEXT1632(auVar97);
      auVar114 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar118);
      auVar91 = vfmadd231ps_fma(auVar114,auVar124,auVar124);
      auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
      fVar204 = auVar114._0_4_;
      fVar206 = auVar114._4_4_;
      fVar207 = auVar114._8_4_;
      fVar88 = auVar114._12_4_;
      fVar89 = auVar114._16_4_;
      fVar146 = auVar114._20_4_;
      fVar147 = auVar114._24_4_;
      auVar37._4_4_ = fVar206 * fVar206 * fVar206 * auVar91._4_4_ * -0.5;
      auVar37._0_4_ = fVar204 * fVar204 * fVar204 * auVar91._0_4_ * -0.5;
      auVar37._8_4_ = fVar207 * fVar207 * fVar207 * auVar91._8_4_ * -0.5;
      auVar37._12_4_ = fVar88 * fVar88 * fVar88 * auVar91._12_4_ * -0.5;
      auVar37._16_4_ = fVar89 * fVar89 * fVar89 * -0.0;
      auVar37._20_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar37._24_4_ = fVar147 * fVar147 * fVar147 * -0.0;
      auVar37._28_4_ = 0;
      auVar116 = vfmadd231ps_avx512vl(auVar37,auVar116,auVar114);
      auVar38._4_4_ = auVar124._4_4_ * auVar116._4_4_;
      auVar38._0_4_ = auVar124._0_4_ * auVar116._0_4_;
      auVar38._8_4_ = auVar124._8_4_ * auVar116._8_4_;
      auVar38._12_4_ = auVar124._12_4_ * auVar116._12_4_;
      auVar38._16_4_ = auVar124._16_4_ * auVar116._16_4_;
      auVar38._20_4_ = auVar124._20_4_ * auVar116._20_4_;
      auVar38._24_4_ = auVar124._24_4_ * auVar116._24_4_;
      auVar38._28_4_ = auVar114._28_4_;
      auVar39._4_4_ = -auVar123._4_4_ * auVar116._4_4_;
      auVar39._0_4_ = -auVar123._0_4_ * auVar116._0_4_;
      auVar39._8_4_ = -auVar123._8_4_ * auVar116._8_4_;
      auVar39._12_4_ = -auVar123._12_4_ * auVar116._12_4_;
      auVar39._16_4_ = -fVar176 * auVar116._16_4_;
      auVar39._20_4_ = -fVar169 * auVar116._20_4_;
      auVar39._24_4_ = -fVar177 * auVar116._24_4_;
      auVar39._28_4_ = auVar115._28_4_;
      auVar116 = vmulps_avx512vl(auVar116,auVar118);
      auVar91 = vfmadd213ps_fma(auVar35,auVar99,auVar117);
      auVar90 = vfmadd213ps_fma(auVar36,auVar99,auVar106);
      auVar115 = vfmadd213ps_avx512vl(auVar113,auVar99,auVar112);
      auVar114 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar154),ZEXT1632(auVar11));
      auVar93 = vfnmadd213ps_fma(auVar35,auVar99,auVar117);
      auVar105 = ZEXT1632(auVar154);
      auVar94 = vfmadd213ps_fma(auVar39,auVar105,ZEXT1632(auVar214));
      auVar95 = vfnmadd213ps_fma(auVar36,auVar99,auVar106);
      auVar8 = vfmadd213ps_fma(auVar116,auVar105,auVar111);
      auVar110 = vfnmadd231ps_avx512vl(auVar112,auVar99,auVar113);
      auVar11 = vfnmadd213ps_fma(auVar38,auVar105,ZEXT1632(auVar11));
      auVar214 = vfnmadd213ps_fma(auVar39,auVar105,ZEXT1632(auVar214));
      auVar96 = vfnmadd231ps_fma(auVar111,ZEXT1632(auVar154),auVar116);
      auVar116 = vsubps_avx512vl(auVar114,ZEXT1632(auVar93));
      auVar113 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar95));
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar8),auVar110);
      auVar112 = vmulps_avx512vl(auVar113,auVar110);
      auVar9 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar95),auVar111);
      auVar40._4_4_ = auVar93._4_4_ * auVar111._4_4_;
      auVar40._0_4_ = auVar93._0_4_ * auVar111._0_4_;
      auVar40._8_4_ = auVar93._8_4_ * auVar111._8_4_;
      auVar40._12_4_ = auVar93._12_4_ * auVar111._12_4_;
      auVar40._16_4_ = auVar111._16_4_ * 0.0;
      auVar40._20_4_ = auVar111._20_4_ * 0.0;
      auVar40._24_4_ = auVar111._24_4_ * 0.0;
      auVar40._28_4_ = auVar111._28_4_;
      auVar111 = vfmsub231ps_avx512vl(auVar40,auVar110,auVar116);
      auVar41._4_4_ = auVar95._4_4_ * auVar116._4_4_;
      auVar41._0_4_ = auVar95._0_4_ * auVar116._0_4_;
      auVar41._8_4_ = auVar95._8_4_ * auVar116._8_4_;
      auVar41._12_4_ = auVar95._12_4_ * auVar116._12_4_;
      auVar41._16_4_ = auVar116._16_4_ * 0.0;
      auVar41._20_4_ = auVar116._20_4_ * 0.0;
      auVar41._24_4_ = auVar116._24_4_ * 0.0;
      auVar41._28_4_ = auVar116._28_4_;
      auVar10 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar93),auVar113);
      auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar118,auVar111);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,ZEXT1632(auVar9));
      auVar119 = ZEXT1632(auVar97);
      uVar78 = vcmpps_avx512vl(auVar113,auVar119,2);
      bVar77 = (byte)uVar78;
      fVar88 = (float)((uint)(bVar77 & 1) * auVar91._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar11._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      fVar146 = (float)((uint)bVar18 * auVar91._4_4_ | (uint)!bVar18 * auVar11._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      fVar148 = (float)((uint)bVar18 * auVar91._8_4_ | (uint)!bVar18 * auVar11._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      fVar150 = (float)((uint)bVar18 * auVar91._12_4_ | (uint)!bVar18 * auVar11._12_4_);
      auVar112 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar148,CONCAT44(fVar146,fVar88))));
      fVar89 = (float)((uint)(bVar77 & 1) * auVar90._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar214._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      fVar147 = (float)((uint)bVar18 * auVar90._4_4_ | (uint)!bVar18 * auVar214._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      fVar149 = (float)((uint)bVar18 * auVar90._8_4_ | (uint)!bVar18 * auVar214._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      fVar151 = (float)((uint)bVar18 * auVar90._12_4_ | (uint)!bVar18 * auVar214._12_4_);
      auVar105 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar149,CONCAT44(fVar147,fVar89))));
      auVar125._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar96._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar125._4_4_ = (float)((uint)bVar18 * auVar115._4_4_ | (uint)!bVar18 * auVar96._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar125._8_4_ = (float)((uint)bVar18 * auVar115._8_4_ | (uint)!bVar18 * auVar96._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar125._12_4_ = (float)((uint)bVar18 * auVar115._12_4_ | (uint)!bVar18 * auVar96._12_4_);
      fVar207 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar115._16_4_);
      auVar125._16_4_ = fVar207;
      fVar204 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar115._20_4_);
      auVar125._20_4_ = fVar204;
      fVar206 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar115._24_4_);
      auVar125._24_4_ = fVar206;
      iVar1 = (uint)(byte)(uVar78 >> 7) * auVar115._28_4_;
      auVar125._28_4_ = iVar1;
      auVar116 = vblendmps_avx512vl(ZEXT1632(auVar93),auVar114);
      auVar126._0_4_ =
           (uint)(bVar77 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar90._0_4_;
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar18 * auVar116._4_4_ | (uint)!bVar18 * auVar90._4_4_;
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar18 * auVar116._8_4_ | (uint)!bVar18 * auVar90._8_4_;
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar18 * auVar116._12_4_ | (uint)!bVar18 * auVar90._12_4_;
      auVar126._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar116._16_4_;
      auVar126._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar116._20_4_;
      auVar126._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar116._24_4_;
      auVar126._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar116._28_4_;
      auVar116 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar94));
      auVar127._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar9._0_4_);
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar127._4_4_ = (float)((uint)bVar18 * auVar116._4_4_ | (uint)!bVar18 * auVar9._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar127._8_4_ = (float)((uint)bVar18 * auVar116._8_4_ | (uint)!bVar18 * auVar9._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar127._12_4_ = (float)((uint)bVar18 * auVar116._12_4_ | (uint)!bVar18 * auVar9._12_4_);
      fVar169 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar116._16_4_);
      auVar127._16_4_ = fVar169;
      fVar177 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar116._20_4_);
      auVar127._20_4_ = fVar177;
      fVar176 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar116._24_4_);
      auVar127._24_4_ = fVar176;
      auVar127._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar116._28_4_;
      auVar116 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar8));
      auVar128._0_4_ =
           (float)((uint)(bVar77 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar115._0_4_)
      ;
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar128._4_4_ = (float)((uint)bVar18 * auVar116._4_4_ | (uint)!bVar18 * auVar115._4_4_);
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar128._8_4_ = (float)((uint)bVar18 * auVar116._8_4_ | (uint)!bVar18 * auVar115._8_4_);
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar128._12_4_ = (float)((uint)bVar18 * auVar116._12_4_ | (uint)!bVar18 * auVar115._12_4_);
      bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar128._16_4_ = (float)((uint)bVar18 * auVar116._16_4_ | (uint)!bVar18 * auVar115._16_4_);
      bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar128._20_4_ = (float)((uint)bVar18 * auVar116._20_4_ | (uint)!bVar18 * auVar115._20_4_);
      bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar128._24_4_ = (float)((uint)bVar18 * auVar116._24_4_ | (uint)!bVar18 * auVar115._24_4_);
      bVar18 = SUB81(uVar78 >> 7,0);
      auVar128._28_4_ = (uint)bVar18 * auVar116._28_4_ | (uint)!bVar18 * auVar115._28_4_;
      auVar129._0_4_ =
           (uint)(bVar77 & 1) * (int)auVar93._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar114._0_4_;
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar129._4_4_ = (uint)bVar18 * (int)auVar93._4_4_ | (uint)!bVar18 * auVar114._4_4_;
      bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar129._8_4_ = (uint)bVar18 * (int)auVar93._8_4_ | (uint)!bVar18 * auVar114._8_4_;
      bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar129._12_4_ = (uint)bVar18 * (int)auVar93._12_4_ | (uint)!bVar18 * auVar114._12_4_;
      auVar129._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar114._16_4_;
      auVar129._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar114._20_4_;
      auVar129._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar114._24_4_;
      auVar129._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar114._28_4_;
      bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
      bVar20 = (bool)((byte)(uVar78 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar130._0_4_ =
           (uint)(bVar77 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar8._0_4_;
      bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar19 * auVar110._4_4_ | (uint)!bVar19 * auVar8._4_4_;
      bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar19 * auVar110._8_4_ | (uint)!bVar19 * auVar8._8_4_;
      bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar19 * auVar110._12_4_ | (uint)!bVar19 * auVar8._12_4_;
      auVar130._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar110._16_4_;
      auVar130._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar110._20_4_;
      auVar130._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar110._24_4_;
      iVar2 = (uint)(byte)(uVar78 >> 7) * auVar110._28_4_;
      auVar130._28_4_ = iVar2;
      auVar106 = vsubps_avx512vl(auVar129,auVar112);
      auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar95._12_4_ |
                                               (uint)!bVar21 * auVar94._12_4_,
                                               CONCAT48((uint)bVar20 * (int)auVar95._8_4_ |
                                                        (uint)!bVar20 * auVar94._8_4_,
                                                        CONCAT44((uint)bVar18 * (int)auVar95._4_4_ |
                                                                 (uint)!bVar18 * auVar94._4_4_,
                                                                 (uint)(bVar77 & 1) *
                                                                 (int)auVar95._0_4_ |
                                                                 (uint)!(bool)(bVar77 & 1) *
                                                                 auVar94._0_4_)))),auVar105);
      auVar200 = ZEXT3264(auVar116);
      auVar115 = vsubps_avx(auVar130,auVar125);
      auVar114 = vsubps_avx(auVar112,auVar126);
      auVar202 = ZEXT3264(auVar114);
      auVar110 = vsubps_avx(auVar105,auVar127);
      auVar111 = vsubps_avx(auVar125,auVar128);
      auVar42._4_4_ = auVar115._4_4_ * fVar146;
      auVar42._0_4_ = auVar115._0_4_ * fVar88;
      auVar42._8_4_ = auVar115._8_4_ * fVar148;
      auVar42._12_4_ = auVar115._12_4_ * fVar150;
      auVar42._16_4_ = auVar115._16_4_ * 0.0;
      auVar42._20_4_ = auVar115._20_4_ * 0.0;
      auVar42._24_4_ = auVar115._24_4_ * 0.0;
      auVar42._28_4_ = iVar2;
      auVar91 = vfmsub231ps_fma(auVar42,auVar125,auVar106);
      auVar43._4_4_ = fVar147 * auVar106._4_4_;
      auVar43._0_4_ = fVar89 * auVar106._0_4_;
      auVar43._8_4_ = fVar149 * auVar106._8_4_;
      auVar43._12_4_ = fVar151 * auVar106._12_4_;
      auVar43._16_4_ = auVar106._16_4_ * 0.0;
      auVar43._20_4_ = auVar106._20_4_ * 0.0;
      auVar43._24_4_ = auVar106._24_4_ * 0.0;
      auVar43._28_4_ = auVar113._28_4_;
      auVar90 = vfmsub231ps_fma(auVar43,auVar112,auVar116);
      auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar119,ZEXT1632(auVar91));
      auVar185._0_4_ = auVar116._0_4_ * auVar125._0_4_;
      auVar185._4_4_ = auVar116._4_4_ * auVar125._4_4_;
      auVar185._8_4_ = auVar116._8_4_ * auVar125._8_4_;
      auVar185._12_4_ = auVar116._12_4_ * auVar125._12_4_;
      auVar185._16_4_ = auVar116._16_4_ * fVar207;
      auVar185._20_4_ = auVar116._20_4_ * fVar204;
      auVar185._24_4_ = auVar116._24_4_ * fVar206;
      auVar185._28_4_ = 0;
      auVar91 = vfmsub231ps_fma(auVar185,auVar105,auVar115);
      auVar117 = vfmadd231ps_avx512vl(auVar113,auVar119,ZEXT1632(auVar91));
      auVar113 = vmulps_avx512vl(auVar111,auVar126);
      auVar113 = vfmsub231ps_avx512vl(auVar113,auVar114,auVar128);
      auVar44._4_4_ = auVar110._4_4_ * auVar128._4_4_;
      auVar44._0_4_ = auVar110._0_4_ * auVar128._0_4_;
      auVar44._8_4_ = auVar110._8_4_ * auVar128._8_4_;
      auVar44._12_4_ = auVar110._12_4_ * auVar128._12_4_;
      auVar44._16_4_ = auVar110._16_4_ * auVar128._16_4_;
      auVar44._20_4_ = auVar110._20_4_ * auVar128._20_4_;
      auVar44._24_4_ = auVar110._24_4_ * auVar128._24_4_;
      auVar44._28_4_ = auVar128._28_4_;
      auVar91 = vfmsub231ps_fma(auVar44,auVar127,auVar111);
      auVar186._0_4_ = auVar127._0_4_ * auVar114._0_4_;
      auVar186._4_4_ = auVar127._4_4_ * auVar114._4_4_;
      auVar186._8_4_ = auVar127._8_4_ * auVar114._8_4_;
      auVar186._12_4_ = auVar127._12_4_ * auVar114._12_4_;
      auVar186._16_4_ = fVar169 * auVar114._16_4_;
      auVar186._20_4_ = fVar177 * auVar114._20_4_;
      auVar186._24_4_ = fVar176 * auVar114._24_4_;
      auVar186._28_4_ = 0;
      auVar90 = vfmsub231ps_fma(auVar186,auVar110,auVar126);
      auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar119,auVar113);
      auVar118 = vfmadd231ps_avx512vl(auVar113,auVar119,ZEXT1632(auVar91));
      auVar191 = ZEXT3264(auVar118);
      auVar113 = vmaxps_avx(auVar117,auVar118);
      uVar167 = vcmpps_avx512vl(auVar113,auVar119,2);
      bVar86 = bVar86 & (byte)uVar167;
      if (bVar86 != 0) {
        auVar45._4_4_ = auVar111._4_4_ * auVar116._4_4_;
        auVar45._0_4_ = auVar111._0_4_ * auVar116._0_4_;
        auVar45._8_4_ = auVar111._8_4_ * auVar116._8_4_;
        auVar45._12_4_ = auVar111._12_4_ * auVar116._12_4_;
        auVar45._16_4_ = auVar111._16_4_ * auVar116._16_4_;
        auVar45._20_4_ = auVar111._20_4_ * auVar116._20_4_;
        auVar45._24_4_ = auVar111._24_4_ * auVar116._24_4_;
        auVar45._28_4_ = auVar113._28_4_;
        auVar8 = vfmsub231ps_fma(auVar45,auVar110,auVar115);
        auVar46._4_4_ = auVar115._4_4_ * auVar114._4_4_;
        auVar46._0_4_ = auVar115._0_4_ * auVar114._0_4_;
        auVar46._8_4_ = auVar115._8_4_ * auVar114._8_4_;
        auVar46._12_4_ = auVar115._12_4_ * auVar114._12_4_;
        auVar46._16_4_ = auVar115._16_4_ * auVar114._16_4_;
        auVar46._20_4_ = auVar115._20_4_ * auVar114._20_4_;
        auVar46._24_4_ = auVar115._24_4_ * auVar114._24_4_;
        auVar46._28_4_ = auVar115._28_4_;
        auVar94 = vfmsub231ps_fma(auVar46,auVar106,auVar111);
        auVar47._4_4_ = auVar110._4_4_ * auVar106._4_4_;
        auVar47._0_4_ = auVar110._0_4_ * auVar106._0_4_;
        auVar47._8_4_ = auVar110._8_4_ * auVar106._8_4_;
        auVar47._12_4_ = auVar110._12_4_ * auVar106._12_4_;
        auVar47._16_4_ = auVar110._16_4_ * auVar106._16_4_;
        auVar47._20_4_ = auVar110._20_4_ * auVar106._20_4_;
        auVar47._24_4_ = auVar110._24_4_ * auVar106._24_4_;
        auVar47._28_4_ = auVar110._28_4_;
        auVar9 = vfmsub231ps_fma(auVar47,auVar114,auVar116);
        auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar9));
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT1632(auVar8),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar113 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
        auVar116 = vfnmadd213ps_avx512vl(auVar113,ZEXT1632(auVar90),auVar120);
        auVar91 = vfmadd132ps_fma(auVar116,auVar113,auVar113);
        auVar200 = ZEXT1664(auVar91);
        auVar48._4_4_ = auVar9._4_4_ * auVar125._4_4_;
        auVar48._0_4_ = auVar9._0_4_ * auVar125._0_4_;
        auVar48._8_4_ = auVar9._8_4_ * auVar125._8_4_;
        auVar48._12_4_ = auVar9._12_4_ * auVar125._12_4_;
        auVar48._16_4_ = fVar207 * 0.0;
        auVar48._20_4_ = fVar204 * 0.0;
        auVar48._24_4_ = fVar206 * 0.0;
        auVar48._28_4_ = iVar1;
        auVar94 = vfmadd231ps_fma(auVar48,auVar105,ZEXT1632(auVar94));
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,ZEXT1632(auVar8));
        fVar204 = auVar91._0_4_;
        fVar206 = auVar91._4_4_;
        fVar207 = auVar91._8_4_;
        fVar177 = auVar91._12_4_;
        fStack_584 = (float)auVar113._28_4_;
        _local_5a0 = ZEXT1628(CONCAT412(auVar94._12_4_ * fVar177,
                                        CONCAT48(auVar94._8_4_ * fVar207,
                                                 CONCAT44(auVar94._4_4_ * fVar206,
                                                          auVar94._0_4_ * fVar204))));
        auVar202 = ZEXT3264(_local_5a0);
        auVar159._4_4_ = local_560;
        auVar159._0_4_ = local_560;
        auVar159._8_4_ = local_560;
        auVar159._12_4_ = local_560;
        auVar159._16_4_ = local_560;
        auVar159._20_4_ = local_560;
        auVar159._24_4_ = local_560;
        auVar159._28_4_ = local_560;
        uVar167 = vcmpps_avx512vl(auVar159,_local_5a0,2);
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar28._4_4_ = uVar166;
        auVar28._0_4_ = uVar166;
        auVar28._8_4_ = uVar166;
        auVar28._12_4_ = uVar166;
        auVar28._16_4_ = uVar166;
        auVar28._20_4_ = uVar166;
        auVar28._24_4_ = uVar166;
        auVar28._28_4_ = uVar166;
        uVar26 = vcmpps_avx512vl(_local_5a0,auVar28,2);
        bVar86 = (byte)uVar167 & (byte)uVar26 & bVar86;
        if (bVar86 != 0) {
          uVar87 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar87 = bVar86 & uVar87;
          if ((char)uVar87 != '\0') {
            fVar169 = auVar117._0_4_ * fVar204;
            fVar176 = auVar117._4_4_ * fVar206;
            auVar49._4_4_ = fVar176;
            auVar49._0_4_ = fVar169;
            fVar88 = auVar117._8_4_ * fVar207;
            auVar49._8_4_ = fVar88;
            fVar89 = auVar117._12_4_ * fVar177;
            auVar49._12_4_ = fVar89;
            fVar146 = auVar117._16_4_ * 0.0;
            auVar49._16_4_ = fVar146;
            fVar147 = auVar117._20_4_ * 0.0;
            auVar49._20_4_ = fVar147;
            fVar148 = auVar117._24_4_ * 0.0;
            auVar49._24_4_ = fVar148;
            auVar49._28_4_ = auVar117._28_4_;
            auVar113 = vsubps_avx512vl(auVar120,auVar49);
            local_420._0_4_ =
                 (float)((uint)(bVar77 & 1) * (int)fVar169 |
                        (uint)!(bool)(bVar77 & 1) * auVar113._0_4_);
            bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
            local_420._4_4_ = (float)((uint)bVar18 * (int)fVar176 | (uint)!bVar18 * auVar113._4_4_);
            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
            local_420._8_4_ = (float)((uint)bVar18 * (int)fVar88 | (uint)!bVar18 * auVar113._8_4_);
            bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
            local_420._12_4_ = (float)((uint)bVar18 * (int)fVar89 | (uint)!bVar18 * auVar113._12_4_)
            ;
            bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
            local_420._16_4_ =
                 (float)((uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar113._16_4_);
            bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
            local_420._20_4_ =
                 (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar113._20_4_);
            bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
            local_420._24_4_ =
                 (float)((uint)bVar18 * (int)fVar148 | (uint)!bVar18 * auVar113._24_4_);
            bVar18 = SUB81(uVar78 >> 7,0);
            local_420._28_4_ =
                 (float)((uint)bVar18 * auVar117._28_4_ | (uint)!bVar18 * auVar113._28_4_);
            auVar113 = vsubps_avx(ZEXT1632(auVar154),auVar99);
            auVar91 = vfmadd213ps_fma(auVar113,local_420,auVar99);
            uVar166 = *(undefined4 *)((long)local_608->ray_space + k * 4 + -0x20);
            auVar29._4_4_ = uVar166;
            auVar29._0_4_ = uVar166;
            auVar29._8_4_ = uVar166;
            auVar29._12_4_ = uVar166;
            auVar29._16_4_ = uVar166;
            auVar29._20_4_ = uVar166;
            auVar29._24_4_ = uVar166;
            auVar29._28_4_ = uVar166;
            auVar113 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                          CONCAT48(auVar91._8_4_ + auVar91._8_4_,
                                                                   CONCAT44(auVar91._4_4_ +
                                                                            auVar91._4_4_,
                                                                            auVar91._0_4_ +
                                                                            auVar91._0_4_)))),
                                       auVar29);
            uVar25 = vcmpps_avx512vl(_local_5a0,auVar113,6);
            uVar87 = uVar87 & uVar25;
            bVar86 = (byte)uVar87;
            if (bVar86 != 0) {
              auVar175._0_4_ = auVar118._0_4_ * fVar204;
              auVar175._4_4_ = auVar118._4_4_ * fVar206;
              auVar175._8_4_ = auVar118._8_4_ * fVar207;
              auVar175._12_4_ = auVar118._12_4_ * fVar177;
              auVar175._16_4_ = auVar118._16_4_ * 0.0;
              auVar175._20_4_ = auVar118._20_4_ * 0.0;
              auVar175._24_4_ = auVar118._24_4_ * 0.0;
              auVar175._28_4_ = 0;
              auVar113 = vsubps_avx512vl(auVar120,auVar175);
              auVar131._0_4_ =
                   (uint)(bVar77 & 1) * (int)auVar175._0_4_ |
                   (uint)!(bool)(bVar77 & 1) * auVar113._0_4_;
              bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
              auVar131._4_4_ = (uint)bVar18 * (int)auVar175._4_4_ | (uint)!bVar18 * auVar113._4_4_;
              bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
              auVar131._8_4_ = (uint)bVar18 * (int)auVar175._8_4_ | (uint)!bVar18 * auVar113._8_4_;
              bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
              auVar131._12_4_ =
                   (uint)bVar18 * (int)auVar175._12_4_ | (uint)!bVar18 * auVar113._12_4_;
              bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
              auVar131._16_4_ =
                   (uint)bVar18 * (int)auVar175._16_4_ | (uint)!bVar18 * auVar113._16_4_;
              bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
              auVar131._20_4_ =
                   (uint)bVar18 * (int)auVar175._20_4_ | (uint)!bVar18 * auVar113._20_4_;
              bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
              auVar131._24_4_ =
                   (uint)bVar18 * (int)auVar175._24_4_ | (uint)!bVar18 * auVar113._24_4_;
              auVar131._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar113._28_4_;
              auVar30._8_4_ = 0x40000000;
              auVar30._0_8_ = 0x4000000040000000;
              auVar30._12_4_ = 0x40000000;
              auVar30._16_4_ = 0x40000000;
              auVar30._20_4_ = 0x40000000;
              auVar30._24_4_ = 0x40000000;
              auVar30._28_4_ = 0x40000000;
              local_400 = vfmsub132ps_avx512vl(auVar131,auVar120,auVar30);
              local_3c0 = 0;
              local_3b0 = local_670;
              uStack_3a8 = uStack_668;
              local_3a0 = local_680;
              uStack_398 = uStack_678;
              local_390 = local_690;
              uStack_388 = uStack_688;
              local_380 = local_6a0;
              uStack_378 = uStack_698;
              if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar170 = 1.0 / auVar100._0_4_;
                local_360[0] = fVar170 * (local_420._0_4_ + 0.0);
                local_360[1] = fVar170 * (local_420._4_4_ + 1.0);
                local_360[2] = fVar170 * (local_420._8_4_ + 2.0);
                local_360[3] = fVar170 * (local_420._12_4_ + 3.0);
                fStack_350 = fVar170 * (local_420._16_4_ + 4.0);
                fStack_34c = fVar170 * (local_420._20_4_ + 5.0);
                fStack_348 = fVar170 * (local_420._24_4_ + 6.0);
                fStack_344 = local_420._28_4_ + 7.0;
                local_340 = local_400;
                local_320 = _local_5a0;
                auVar160._8_4_ = 0x7f800000;
                auVar160._0_8_ = 0x7f8000007f800000;
                auVar160._12_4_ = 0x7f800000;
                auVar160._16_4_ = 0x7f800000;
                auVar160._20_4_ = 0x7f800000;
                auVar160._24_4_ = 0x7f800000;
                auVar160._28_4_ = 0x7f800000;
                auVar113 = vblendmps_avx512vl(auVar160,_local_5a0);
                auVar132._0_4_ =
                     (uint)(bVar86 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                bVar18 = (bool)((byte)(uVar87 >> 1) & 1);
                auVar132._4_4_ = (uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                auVar132._8_4_ = (uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar87 >> 3) & 1);
                auVar132._12_4_ = (uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar87 >> 4) & 1);
                auVar132._16_4_ = (uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar87 >> 5) & 1);
                auVar132._20_4_ = (uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar87 >> 6) & 1);
                auVar132._24_4_ = (uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = SUB81(uVar87 >> 7,0);
                auVar132._28_4_ = (uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * 0x7f800000;
                auVar113 = vshufps_avx(auVar132,auVar132,0xb1);
                auVar113 = vminps_avx(auVar132,auVar113);
                auVar116 = vshufpd_avx(auVar113,auVar113,5);
                auVar113 = vminps_avx(auVar113,auVar116);
                auVar116 = vpermpd_avx2(auVar113,0x4e);
                auVar113 = vminps_avx(auVar113,auVar116);
                uVar167 = vcmpps_avx512vl(auVar132,auVar113,0);
                uVar79 = (uint)uVar87;
                if ((bVar86 & (byte)uVar167) != 0) {
                  uVar79 = (uint)(bVar86 & (byte)uVar167);
                }
                uVar27 = 0;
                for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                  uVar27 = uVar27 + 1;
                }
                uVar78 = (ulong)uVar27;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_580._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                  local_3e0 = _local_5a0;
                  local_3bc = iVar13;
                  do {
                    local_1c0 = local_360[uVar78];
                    local_1a0 = *(undefined4 *)(local_340 + uVar78 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar78 * 4);
                    local_660.context = context->user;
                    fVar204 = 1.0 - local_1c0;
                    fVar170 = fVar204 * fVar204 * -3.0;
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * fVar204)),
                                              ZEXT416((uint)(local_1c0 * fVar204)),
                                              ZEXT416(0xc0000000));
                    auVar90 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar204)),
                                              ZEXT416((uint)(local_1c0 * local_1c0)),
                                              ZEXT416(0x40000000));
                    fVar204 = auVar91._0_4_ * 3.0;
                    fVar206 = auVar90._0_4_ * 3.0;
                    fVar207 = local_1c0 * local_1c0 * 3.0;
                    auVar196._0_4_ = fVar207 * fVar67;
                    auVar196._4_4_ = fVar207 * fVar68;
                    auVar196._8_4_ = fVar207 * fVar69;
                    auVar196._12_4_ = fVar207 * fVar76;
                    auVar157._4_4_ = fVar206;
                    auVar157._0_4_ = fVar206;
                    auVar157._8_4_ = fVar206;
                    auVar157._12_4_ = fVar206;
                    auVar91 = vfmadd132ps_fma(auVar157,auVar196,auVar92);
                    auVar182._4_4_ = fVar204;
                    auVar182._0_4_ = fVar204;
                    auVar182._8_4_ = fVar204;
                    auVar182._12_4_ = fVar204;
                    auVar91 = vfmadd132ps_fma(auVar182,auVar91,auVar7);
                    auVar158._4_4_ = fVar170;
                    auVar158._0_4_ = fVar170;
                    auVar158._8_4_ = fVar170;
                    auVar158._12_4_ = fVar170;
                    auVar91 = vfmadd132ps_fma(auVar158,auVar91,auVar6);
                    local_220 = auVar91._0_4_;
                    auVar190._8_4_ = 1;
                    auVar190._0_8_ = 0x100000001;
                    auVar190._12_4_ = 1;
                    auVar190._16_4_ = 1;
                    auVar190._20_4_ = 1;
                    auVar190._24_4_ = 1;
                    auVar190._28_4_ = 1;
                    local_200 = vpermps_avx2(auVar190,ZEXT1632(auVar91));
                    auVar191 = ZEXT3264(local_200);
                    auVar197._8_4_ = 2;
                    auVar197._0_8_ = 0x200000002;
                    auVar197._12_4_ = 2;
                    auVar199._16_4_ = 2;
                    auVar199._0_16_ = auVar197;
                    auVar199._20_4_ = 2;
                    auVar199._24_4_ = 2;
                    auVar199._28_4_ = 2;
                    auVar200 = ZEXT3264(auVar199);
                    local_1e0 = vpermps_avx2(auVar199,ZEXT1632(auVar91));
                    iStack_21c = local_220;
                    iStack_218 = local_220;
                    iStack_214 = local_220;
                    iStack_210 = local_220;
                    iStack_20c = local_220;
                    iStack_208 = local_220;
                    iStack_204 = local_220;
                    fStack_1bc = local_1c0;
                    fStack_1b8 = local_1c0;
                    fStack_1b4 = local_1c0;
                    fStack_1b0 = local_1c0;
                    fStack_1ac = local_1c0;
                    fStack_1a8 = local_1c0;
                    fStack_1a4 = local_1c0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_2e0._0_8_;
                    uStack_178 = local_2e0._8_8_;
                    uStack_170 = local_2e0._16_8_;
                    uStack_168 = local_2e0._24_8_;
                    local_160 = local_2c0;
                    auVar113 = vpcmpeqd_avx2(local_2c0,local_2c0);
                    local_610[1] = auVar113;
                    *local_610 = auVar113;
                    local_140 = (local_660.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_660.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_600 = local_300;
                    local_660.valid = (int *)local_600;
                    local_660.geometryUserPtr = pGVar83->userPtr;
                    local_660.hit = (RTCHitN *)&local_220;
                    local_660.N = 8;
                    local_660.ray = (RTCRayN *)ray;
                    if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar191 = ZEXT1664(local_200._0_16_);
                      auVar200 = ZEXT1664(auVar197);
                      (*pGVar83->intersectionFilterN)(&local_660);
                      auVar202 = ZEXT3264(_local_5a0);
                      auVar219 = ZEXT464(0xbf800000);
                      auVar218 = ZEXT3264(local_540);
                      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar217 = ZEXT3264(auVar113);
                    }
                    if (local_600 == (undefined1  [32])0x0) {
LAB_01b08072:
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_580._0_4_;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar191 = ZEXT1664(auVar191._0_16_);
                        auVar200 = ZEXT1664(auVar200._0_16_);
                        (*p_Var17)(&local_660);
                        auVar202 = ZEXT3264(_local_5a0);
                        auVar219 = ZEXT464(0xbf800000);
                        auVar218 = ZEXT3264(local_540);
                        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar217 = ZEXT3264(auVar113);
                      }
                      if (local_600 == (undefined1  [32])0x0) goto LAB_01b08072;
                      uVar25 = vptestmd_avx512vl(local_600,local_600);
                      iVar1 = *(int *)(local_660.hit + 4);
                      iVar2 = *(int *)(local_660.hit + 8);
                      iVar70 = *(int *)(local_660.hit + 0xc);
                      iVar71 = *(int *)(local_660.hit + 0x10);
                      iVar72 = *(int *)(local_660.hit + 0x14);
                      iVar73 = *(int *)(local_660.hit + 0x18);
                      iVar74 = *(int *)(local_660.hit + 0x1c);
                      bVar86 = (byte)uVar25;
                      bVar18 = (bool)((byte)(uVar25 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar25 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar25 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar25 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar25 >> 6) & 1);
                      bVar24 = SUB81(uVar25 >> 7,0);
                      *(uint *)(local_660.ray + 0x180) =
                           (uint)(bVar86 & 1) * *(int *)local_660.hit |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x180);
                      *(uint *)(local_660.ray + 0x184) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_660.ray + 0x184);
                      *(uint *)(local_660.ray + 0x188) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_660.ray + 0x188);
                      *(uint *)(local_660.ray + 0x18c) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_660.ray + 0x18c);
                      *(uint *)(local_660.ray + 400) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_660.ray + 400);
                      *(uint *)(local_660.ray + 0x194) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_660.ray + 0x194);
                      *(uint *)(local_660.ray + 0x198) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_660.ray + 0x198);
                      *(uint *)(local_660.ray + 0x19c) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_660.ray + 0x19c);
                      iVar1 = *(int *)(local_660.hit + 0x24);
                      iVar2 = *(int *)(local_660.hit + 0x28);
                      iVar70 = *(int *)(local_660.hit + 0x2c);
                      iVar71 = *(int *)(local_660.hit + 0x30);
                      iVar72 = *(int *)(local_660.hit + 0x34);
                      iVar73 = *(int *)(local_660.hit + 0x38);
                      iVar74 = *(int *)(local_660.hit + 0x3c);
                      bVar18 = (bool)((byte)(uVar25 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar25 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar25 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar25 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar25 >> 6) & 1);
                      bVar24 = SUB81(uVar25 >> 7,0);
                      *(uint *)(local_660.ray + 0x1a0) =
                           (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x20) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1a0);
                      *(uint *)(local_660.ray + 0x1a4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1a4);
                      *(uint *)(local_660.ray + 0x1a8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1a8);
                      *(uint *)(local_660.ray + 0x1ac) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1ac);
                      *(uint *)(local_660.ray + 0x1b0) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_660.ray + 0x1b0);
                      *(uint *)(local_660.ray + 0x1b4) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_660.ray + 0x1b4);
                      *(uint *)(local_660.ray + 0x1b8) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_660.ray + 0x1b8);
                      *(uint *)(local_660.ray + 0x1bc) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_660.ray + 0x1bc);
                      iVar1 = *(int *)(local_660.hit + 0x44);
                      iVar2 = *(int *)(local_660.hit + 0x48);
                      iVar70 = *(int *)(local_660.hit + 0x4c);
                      iVar71 = *(int *)(local_660.hit + 0x50);
                      iVar72 = *(int *)(local_660.hit + 0x54);
                      iVar73 = *(int *)(local_660.hit + 0x58);
                      iVar74 = *(int *)(local_660.hit + 0x5c);
                      bVar18 = (bool)((byte)(uVar25 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar25 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar25 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar25 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar25 >> 6) & 1);
                      bVar24 = SUB81(uVar25 >> 7,0);
                      *(uint *)(local_660.ray + 0x1c0) =
                           (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x40) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1c0);
                      *(uint *)(local_660.ray + 0x1c4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1c4);
                      *(uint *)(local_660.ray + 0x1c8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1c8);
                      *(uint *)(local_660.ray + 0x1cc) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1cc);
                      *(uint *)(local_660.ray + 0x1d0) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_660.ray + 0x1d0);
                      *(uint *)(local_660.ray + 0x1d4) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_660.ray + 0x1d4);
                      *(uint *)(local_660.ray + 0x1d8) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_660.ray + 0x1d8);
                      *(uint *)(local_660.ray + 0x1dc) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_660.ray + 0x1dc);
                      iVar1 = *(int *)(local_660.hit + 100);
                      iVar2 = *(int *)(local_660.hit + 0x68);
                      iVar70 = *(int *)(local_660.hit + 0x6c);
                      iVar71 = *(int *)(local_660.hit + 0x70);
                      iVar72 = *(int *)(local_660.hit + 0x74);
                      iVar73 = *(int *)(local_660.hit + 0x78);
                      iVar74 = *(int *)(local_660.hit + 0x7c);
                      bVar18 = (bool)((byte)(uVar25 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar25 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar25 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar25 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar25 >> 6) & 1);
                      bVar24 = SUB81(uVar25 >> 7,0);
                      *(uint *)(local_660.ray + 0x1e0) =
                           (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x60) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1e0);
                      *(uint *)(local_660.ray + 0x1e4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1e4);
                      *(uint *)(local_660.ray + 0x1e8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1e8);
                      *(uint *)(local_660.ray + 0x1ec) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_660.ray + 0x1ec);
                      *(uint *)(local_660.ray + 0x1f0) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_660.ray + 0x1f0);
                      *(uint *)(local_660.ray + 500) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_660.ray + 500);
                      *(uint *)(local_660.ray + 0x1f8) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_660.ray + 0x1f8);
                      *(uint *)(local_660.ray + 0x1fc) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_660.ray + 0x1fc);
                      iVar1 = *(int *)(local_660.hit + 0x84);
                      iVar2 = *(int *)(local_660.hit + 0x88);
                      iVar70 = *(int *)(local_660.hit + 0x8c);
                      iVar71 = *(int *)(local_660.hit + 0x90);
                      iVar72 = *(int *)(local_660.hit + 0x94);
                      iVar73 = *(int *)(local_660.hit + 0x98);
                      iVar74 = *(int *)(local_660.hit + 0x9c);
                      bVar18 = (bool)((byte)(uVar25 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar25 >> 2) & 1);
                      bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
                      bVar21 = (bool)((byte)(uVar25 >> 4) & 1);
                      bVar22 = (bool)((byte)(uVar25 >> 5) & 1);
                      bVar23 = (bool)((byte)(uVar25 >> 6) & 1);
                      bVar24 = SUB81(uVar25 >> 7,0);
                      *(uint *)(local_660.ray + 0x200) =
                           (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x80) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x200);
                      *(uint *)(local_660.ray + 0x204) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_660.ray + 0x204);
                      *(uint *)(local_660.ray + 0x208) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_660.ray + 0x208);
                      *(uint *)(local_660.ray + 0x20c) =
                           (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_660.ray + 0x20c);
                      *(uint *)(local_660.ray + 0x210) =
                           (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_660.ray + 0x210);
                      *(uint *)(local_660.ray + 0x214) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_660.ray + 0x214);
                      *(uint *)(local_660.ray + 0x218) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_660.ray + 0x218);
                      *(uint *)(local_660.ray + 0x21c) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_660.ray + 0x21c);
                      auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0));
                      *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar113;
                      auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0));
                      *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar113;
                      auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0));
                      *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar113;
                      auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0x100));
                      *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar113;
                      local_580._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_580._4_4_ = 0;
                      local_580._8_4_ = 0;
                      local_580._12_4_ = 0;
                    }
                    bVar86 = ~(byte)(1 << ((uint)uVar78 & 0x1f)) & (byte)uVar87;
                    auVar164._4_4_ = local_580._0_4_;
                    auVar164._0_4_ = local_580._0_4_;
                    auVar164._8_4_ = local_580._0_4_;
                    auVar164._12_4_ = local_580._0_4_;
                    auVar164._16_4_ = local_580._0_4_;
                    auVar164._20_4_ = local_580._0_4_;
                    auVar164._24_4_ = local_580._0_4_;
                    auVar164._28_4_ = local_580._0_4_;
                    uVar167 = vcmpps_avx512vl(auVar202._0_32_,auVar164,2);
                    if ((bVar86 & (byte)uVar167) == 0) goto LAB_01b0703f;
                    bVar86 = bVar86 & (byte)uVar167;
                    uVar87 = (ulong)bVar86;
                    auVar165._8_4_ = 0x7f800000;
                    auVar165._0_8_ = 0x7f8000007f800000;
                    auVar165._12_4_ = 0x7f800000;
                    auVar165._16_4_ = 0x7f800000;
                    auVar165._20_4_ = 0x7f800000;
                    auVar165._24_4_ = 0x7f800000;
                    auVar165._28_4_ = 0x7f800000;
                    auVar113 = vblendmps_avx512vl(auVar165,auVar202._0_32_);
                    auVar145._0_4_ =
                         (uint)(bVar86 & 1) * auVar113._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                    bVar18 = (bool)(bVar86 >> 1 & 1);
                    auVar145._4_4_ = (uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar86 >> 2 & 1);
                    auVar145._8_4_ = (uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar86 >> 3 & 1);
                    auVar145._12_4_ = (uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar86 >> 4 & 1);
                    auVar145._16_4_ = (uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar86 >> 5 & 1);
                    auVar145._20_4_ = (uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar86 >> 6 & 1);
                    auVar145._24_4_ = (uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar145._28_4_ =
                         (uint)(bVar86 >> 7) * auVar113._28_4_ |
                         (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                    auVar113 = vshufps_avx(auVar145,auVar145,0xb1);
                    auVar113 = vminps_avx(auVar145,auVar113);
                    auVar116 = vshufpd_avx(auVar113,auVar113,5);
                    auVar113 = vminps_avx(auVar113,auVar116);
                    auVar116 = vpermpd_avx2(auVar113,0x4e);
                    auVar113 = vminps_avx(auVar113,auVar116);
                    uVar167 = vcmpps_avx512vl(auVar145,auVar113,0);
                    bVar77 = (byte)uVar167 & bVar86;
                    if (bVar77 != 0) {
                      bVar86 = bVar77;
                    }
                    uVar85 = 0;
                    for (uVar79 = (uint)bVar86; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000
                        ) {
                      uVar85 = uVar85 + 1;
                    }
                    uVar78 = (ulong)uVar85;
                  } while( true );
                }
                fVar170 = local_360[uVar78];
                uVar166 = *(undefined4 *)(local_340 + uVar78 * 4);
                fVar206 = 1.0 - fVar170;
                fVar204 = fVar206 * fVar206 * -3.0;
                auVar191 = ZEXT464((uint)fVar204);
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),
                                          ZEXT416((uint)(fVar170 * fVar206)),ZEXT416(0xc0000000));
                auVar90 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar206)),
                                          ZEXT416((uint)(fVar170 * fVar170)),ZEXT416(0x40000000));
                fVar206 = auVar91._0_4_ * 3.0;
                fVar207 = auVar90._0_4_ * 3.0;
                fVar177 = fVar170 * fVar170 * 3.0;
                auVar192._0_4_ = fVar177 * fVar67;
                auVar192._4_4_ = fVar177 * fVar68;
                auVar192._8_4_ = fVar177 * fVar69;
                auVar192._12_4_ = fVar177 * fVar76;
                auVar200 = ZEXT1664(auVar192);
                auVar171._4_4_ = fVar207;
                auVar171._0_4_ = fVar207;
                auVar171._8_4_ = fVar207;
                auVar171._12_4_ = fVar207;
                auVar91 = vfmadd132ps_fma(auVar171,auVar192,auVar92);
                auVar179._4_4_ = fVar206;
                auVar179._0_4_ = fVar206;
                auVar179._8_4_ = fVar206;
                auVar179._12_4_ = fVar206;
                auVar91 = vfmadd132ps_fma(auVar179,auVar91,auVar7);
                auVar172._4_4_ = fVar204;
                auVar172._0_4_ = fVar204;
                auVar172._8_4_ = fVar204;
                auVar172._12_4_ = fVar204;
                auVar91 = vfmadd132ps_fma(auVar172,auVar91,auVar6);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar78 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar91._0_4_;
                uVar14 = vextractps_avx(auVar91,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar14;
                uVar14 = vextractps_avx(auVar91,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar14;
                *(float *)(ray + k * 4 + 0x1e0) = fVar170;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar166;
                *(uint *)(ray + k * 4 + 0x220) = uVar85;
                *(uint *)(ray + k * 4 + 0x240) = uVar12;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_01b0703f:
                fVar170 = (float)local_630._0_4_;
              }
            }
          }
        }
      }
    }
    local_630._0_4_ = fVar170;
    if (8 < iVar13) {
      local_580 = vpbroadcastd_avx512vl();
      local_5a0._4_4_ = local_630._0_4_;
      local_5a0._0_4_ = local_630._0_4_;
      fStack_598 = (float)local_630._0_4_;
      fStack_594 = (float)local_630._0_4_;
      fStack_590 = (float)local_630._0_4_;
      fStack_58c = (float)local_630._0_4_;
      fStack_588 = (float)local_630._0_4_;
      fStack_584 = (float)local_630._0_4_;
      uStack_55c = local_560;
      uStack_558 = local_560;
      uStack_554 = local_560;
      uStack_550 = local_560;
      uStack_54c = local_560;
      uStack_548 = local_560;
      uStack_544 = local_560;
      local_100 = 1.0 / (float)local_5c0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar81 = 8;
LAB_01b070dc:
      if (lVar81 < iVar13) {
        auVar113 = vpbroadcastd_avx512vl();
        auVar113 = vpor_avx2(auVar113,_DAT_01fb4ba0);
        uVar26 = vpcmpd_avx512vl(auVar113,local_580,1);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar84);
        auVar116 = *(undefined1 (*) [32])(lVar84 + 0x21fb768 + lVar81 * 4);
        auVar115 = *(undefined1 (*) [32])(lVar84 + 0x21fbbec + lVar81 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar84 + 0x21fc070 + lVar81 * 4);
        auVar201._0_4_ = auVar114._0_4_ * (float)local_500._0_4_;
        auVar201._4_4_ = auVar114._4_4_ * (float)local_500._4_4_;
        auVar201._8_4_ = auVar114._8_4_ * fStack_4f8;
        auVar201._12_4_ = auVar114._12_4_ * fStack_4f4;
        auVar201._16_4_ = auVar114._16_4_ * fStack_4f0;
        auVar201._20_4_ = auVar114._20_4_ * fStack_4ec;
        auVar201._28_36_ = auVar200._28_36_;
        auVar201._24_4_ = auVar114._24_4_ * fStack_4e8;
        auVar200._0_4_ = auVar114._0_4_ * (float)local_520._0_4_;
        auVar200._4_4_ = auVar114._4_4_ * (float)local_520._4_4_;
        auVar200._8_4_ = auVar114._8_4_ * fStack_518;
        auVar200._12_4_ = auVar114._12_4_ * fStack_514;
        auVar200._16_4_ = auVar114._16_4_ * fStack_510;
        auVar200._20_4_ = auVar114._20_4_ * fStack_50c;
        auVar200._28_36_ = auVar191._28_36_;
        auVar200._24_4_ = auVar114._24_4_ * fStack_508;
        auVar110 = vmulps_avx512vl(local_e0,auVar114);
        auVar111 = vfmadd231ps_avx512vl(auVar201._0_32_,auVar115,local_4c0);
        auVar112 = vfmadd231ps_avx512vl(auVar200._0_32_,auVar115,local_4e0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_c0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_480);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_4a0);
        auVar105 = vfmadd231ps_avx512vl(auVar110,auVar116,local_a0);
        auVar91 = vfmadd231ps_fma(auVar111,auVar113,local_440);
        auVar200 = ZEXT1664(auVar91);
        auVar90 = vfmadd231ps_fma(auVar112,auVar113,local_460);
        auVar191 = ZEXT1664(auVar90);
        auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar84);
        auVar111 = *(undefined1 (*) [32])(lVar84 + 0x21fdb88 + lVar81 * 4);
        auVar118 = vfmadd231ps_avx512vl(auVar105,auVar113,local_80);
        auVar112 = *(undefined1 (*) [32])(lVar84 + 0x21fe00c + lVar81 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar84 + 0x21fe490 + lVar81 * 4);
        auVar203._0_4_ = auVar105._0_4_ * (float)local_500._0_4_;
        auVar203._4_4_ = auVar105._4_4_ * (float)local_500._4_4_;
        auVar203._8_4_ = auVar105._8_4_ * fStack_4f8;
        auVar203._12_4_ = auVar105._12_4_ * fStack_4f4;
        auVar203._16_4_ = auVar105._16_4_ * fStack_4f0;
        auVar203._20_4_ = auVar105._20_4_ * fStack_4ec;
        auVar203._28_36_ = auVar202._28_36_;
        auVar203._24_4_ = auVar105._24_4_ * fStack_4e8;
        auVar50._4_4_ = auVar105._4_4_ * (float)local_520._4_4_;
        auVar50._0_4_ = auVar105._0_4_ * (float)local_520._0_4_;
        auVar50._8_4_ = auVar105._8_4_ * fStack_518;
        auVar50._12_4_ = auVar105._12_4_ * fStack_514;
        auVar50._16_4_ = auVar105._16_4_ * fStack_510;
        auVar50._20_4_ = auVar105._20_4_ * fStack_50c;
        auVar50._24_4_ = auVar105._24_4_ * fStack_508;
        auVar50._28_4_ = uStack_504;
        auVar106 = vmulps_avx512vl(local_e0,auVar105);
        auVar117 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar112,local_4c0);
        auVar119 = vfmadd231ps_avx512vl(auVar50,auVar112,local_4e0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar112,local_c0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar111,local_480);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar111,local_4a0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,local_a0);
        auVar94 = vfmadd231ps_fma(auVar117,auVar110,local_440);
        auVar202 = ZEXT1664(auVar94);
        auVar8 = vfmadd231ps_fma(auVar119,auVar110,local_460);
        auVar119 = vfmadd231ps_avx512vl(auVar106,auVar110,local_80);
        auVar120 = vmaxps_avx512vl(auVar118,auVar119);
        auVar106 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar91));
        auVar117 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar90));
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar90),auVar106);
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar91),auVar117);
        auVar99 = vsubps_avx512vl(auVar99,auVar100);
        auVar100 = vmulps_avx512vl(auVar117,auVar117);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar106);
        auVar120 = vmulps_avx512vl(auVar120,auVar120);
        auVar120 = vmulps_avx512vl(auVar120,auVar100);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        uVar167 = vcmpps_avx512vl(auVar99,auVar120,2);
        bVar86 = (byte)uVar26 & (byte)uVar167;
        if (bVar86 != 0) {
          auVar105 = vmulps_avx512vl(local_2a0,auVar105);
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_280,auVar105);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_260,auVar112);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_240,auVar111);
          auVar114 = vmulps_avx512vl(local_2a0,auVar114);
          auVar115 = vfmadd213ps_avx512vl(auVar115,local_280,auVar114);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_260,auVar115);
          auVar111 = vfmadd213ps_avx512vl(auVar113,local_240,auVar116);
          auVar113 = *(undefined1 (*) [32])(lVar84 + 0x21fc4f4 + lVar81 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar84 + 0x21fc978 + lVar81 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar84 + 0x21fcdfc + lVar81 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar84 + 0x21fd280 + lVar81 * 4);
          auVar112 = vmulps_avx512vl(_local_500,auVar114);
          auVar105 = vmulps_avx512vl(_local_520,auVar114);
          auVar114 = vmulps_avx512vl(local_2a0,auVar114);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_4c0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_4e0);
          auVar115 = vfmadd231ps_avx512vl(auVar114,local_280,auVar115);
          auVar114 = vfmadd231ps_avx512vl(auVar112,auVar116,local_480);
          auVar112 = vfmadd231ps_avx512vl(auVar105,auVar116,local_4a0);
          auVar116 = vfmadd231ps_avx512vl(auVar115,local_260,auVar116);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar113,local_440);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar113,local_460);
          auVar105 = vfmadd231ps_avx512vl(auVar116,local_240,auVar113);
          auVar113 = *(undefined1 (*) [32])(lVar84 + 0x21fe914 + lVar81 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar84 + 0x21ff21c + lVar81 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar84 + 0x21ff6a0 + lVar81 * 4);
          auVar120 = vmulps_avx512vl(_local_500,auVar115);
          auVar99 = vmulps_avx512vl(_local_520,auVar115);
          auVar115 = vmulps_avx512vl(local_2a0,auVar115);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_4c0);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar116,local_4e0);
          auVar115 = vfmadd231ps_avx512vl(auVar115,local_280,auVar116);
          auVar116 = *(undefined1 (*) [32])(lVar84 + 0x21fed98 + lVar81 * 4);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,local_480);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar116,local_4a0);
          auVar116 = vfmadd231ps_avx512vl(auVar115,local_260,auVar116);
          auVar115 = vfmadd231ps_avx512vl(auVar120,auVar113,local_440);
          auVar120 = vfmadd231ps_avx512vl(auVar99,auVar113,local_460);
          auVar116 = vfmadd231ps_avx512vl(auVar116,local_240,auVar113);
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar114,auVar99);
          vandps_avx512vl(auVar112,auVar99);
          auVar113 = vmaxps_avx(auVar99,auVar99);
          vandps_avx512vl(auVar105,auVar99);
          auVar113 = vmaxps_avx(auVar113,auVar99);
          uVar78 = vcmpps_avx512vl(auVar113,_local_5a0,1);
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar133._0_4_ = (float)((uint)bVar18 * auVar106._0_4_ | (uint)!bVar18 * auVar114._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar18 * auVar106._4_4_ | (uint)!bVar18 * auVar114._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar18 * auVar106._8_4_ | (uint)!bVar18 * auVar114._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar133._12_4_ =
               (float)((uint)bVar18 * auVar106._12_4_ | (uint)!bVar18 * auVar114._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar133._16_4_ =
               (float)((uint)bVar18 * auVar106._16_4_ | (uint)!bVar18 * auVar114._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar133._20_4_ =
               (float)((uint)bVar18 * auVar106._20_4_ | (uint)!bVar18 * auVar114._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar133._24_4_ =
               (float)((uint)bVar18 * auVar106._24_4_ | (uint)!bVar18 * auVar114._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar133._28_4_ = (uint)bVar18 * auVar106._28_4_ | (uint)!bVar18 * auVar114._28_4_;
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar134._0_4_ = (float)((uint)bVar18 * auVar117._0_4_ | (uint)!bVar18 * auVar112._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar18 * auVar117._4_4_ | (uint)!bVar18 * auVar112._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar18 * auVar117._8_4_ | (uint)!bVar18 * auVar112._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar134._12_4_ =
               (float)((uint)bVar18 * auVar117._12_4_ | (uint)!bVar18 * auVar112._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar134._16_4_ =
               (float)((uint)bVar18 * auVar117._16_4_ | (uint)!bVar18 * auVar112._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar134._20_4_ =
               (float)((uint)bVar18 * auVar117._20_4_ | (uint)!bVar18 * auVar112._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar134._24_4_ =
               (float)((uint)bVar18 * auVar117._24_4_ | (uint)!bVar18 * auVar112._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar134._28_4_ = (uint)bVar18 * auVar117._28_4_ | (uint)!bVar18 * auVar112._28_4_;
          vandps_avx512vl(auVar115,auVar99);
          vandps_avx512vl(auVar120,auVar99);
          auVar113 = vmaxps_avx(auVar134,auVar134);
          vandps_avx512vl(auVar116,auVar99);
          auVar113 = vmaxps_avx(auVar113,auVar134);
          uVar78 = vcmpps_avx512vl(auVar113,_local_5a0,1);
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar135._0_4_ = (uint)bVar18 * auVar106._0_4_ | (uint)!bVar18 * auVar115._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar18 * auVar106._4_4_ | (uint)!bVar18 * auVar115._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar18 * auVar106._8_4_ | (uint)!bVar18 * auVar115._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar18 * auVar106._12_4_ | (uint)!bVar18 * auVar115._12_4_;
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar135._16_4_ = (uint)bVar18 * auVar106._16_4_ | (uint)!bVar18 * auVar115._16_4_;
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar135._20_4_ = (uint)bVar18 * auVar106._20_4_ | (uint)!bVar18 * auVar115._20_4_;
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar135._24_4_ = (uint)bVar18 * auVar106._24_4_ | (uint)!bVar18 * auVar115._24_4_;
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar135._28_4_ = (uint)bVar18 * auVar106._28_4_ | (uint)!bVar18 * auVar115._28_4_;
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar136._0_4_ = (float)((uint)bVar18 * auVar117._0_4_ | (uint)!bVar18 * auVar120._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar18 * auVar117._4_4_ | (uint)!bVar18 * auVar120._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar18 * auVar117._8_4_ | (uint)!bVar18 * auVar120._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar18 * auVar117._12_4_ | (uint)!bVar18 * auVar120._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar136._16_4_ =
               (float)((uint)bVar18 * auVar117._16_4_ | (uint)!bVar18 * auVar120._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar136._20_4_ =
               (float)((uint)bVar18 * auVar117._20_4_ | (uint)!bVar18 * auVar120._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar136._24_4_ =
               (float)((uint)bVar18 * auVar117._24_4_ | (uint)!bVar18 * auVar120._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar136._28_4_ = (uint)bVar18 * auVar117._28_4_ | (uint)!bVar18 * auVar120._28_4_;
          auVar209._8_4_ = 0x80000000;
          auVar209._0_8_ = 0x8000000080000000;
          auVar209._12_4_ = 0x80000000;
          auVar209._16_4_ = 0x80000000;
          auVar209._20_4_ = 0x80000000;
          auVar209._24_4_ = 0x80000000;
          auVar209._28_4_ = 0x80000000;
          auVar113 = vxorps_avx512vl(auVar135,auVar209);
          auVar98 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          auVar116 = vfmadd213ps_avx512vl(auVar133,auVar133,ZEXT1632(auVar98));
          auVar9 = vfmadd231ps_fma(auVar116,auVar134,auVar134);
          auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar9));
          auVar216._8_4_ = 0xbf000000;
          auVar216._0_8_ = 0xbf000000bf000000;
          auVar216._12_4_ = 0xbf000000;
          auVar216._16_4_ = 0xbf000000;
          auVar216._20_4_ = 0xbf000000;
          auVar216._24_4_ = 0xbf000000;
          auVar216._28_4_ = 0xbf000000;
          fVar170 = auVar116._0_4_;
          fVar204 = auVar116._4_4_;
          fVar206 = auVar116._8_4_;
          fVar207 = auVar116._12_4_;
          fVar177 = auVar116._16_4_;
          fVar169 = auVar116._20_4_;
          fVar176 = auVar116._24_4_;
          auVar51._4_4_ = fVar204 * fVar204 * fVar204 * auVar9._4_4_ * -0.5;
          auVar51._0_4_ = fVar170 * fVar170 * fVar170 * auVar9._0_4_ * -0.5;
          auVar51._8_4_ = fVar206 * fVar206 * fVar206 * auVar9._8_4_ * -0.5;
          auVar51._12_4_ = fVar207 * fVar207 * fVar207 * auVar9._12_4_ * -0.5;
          auVar51._16_4_ = fVar177 * fVar177 * fVar177 * -0.0;
          auVar51._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar51._24_4_ = fVar176 * fVar176 * fVar176 * -0.0;
          auVar51._28_4_ = auVar134._28_4_;
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar116 = vfmadd231ps_avx512vl(auVar51,auVar115,auVar116);
          auVar52._4_4_ = auVar134._4_4_ * auVar116._4_4_;
          auVar52._0_4_ = auVar134._0_4_ * auVar116._0_4_;
          auVar52._8_4_ = auVar134._8_4_ * auVar116._8_4_;
          auVar52._12_4_ = auVar134._12_4_ * auVar116._12_4_;
          auVar52._16_4_ = auVar134._16_4_ * auVar116._16_4_;
          auVar52._20_4_ = auVar134._20_4_ * auVar116._20_4_;
          auVar52._24_4_ = auVar134._24_4_ * auVar116._24_4_;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = auVar116._4_4_ * -auVar133._4_4_;
          auVar53._0_4_ = auVar116._0_4_ * -auVar133._0_4_;
          auVar53._8_4_ = auVar116._8_4_ * -auVar133._8_4_;
          auVar53._12_4_ = auVar116._12_4_ * -auVar133._12_4_;
          auVar53._16_4_ = auVar116._16_4_ * -auVar133._16_4_;
          auVar53._20_4_ = auVar116._20_4_ * -auVar133._20_4_;
          auVar53._24_4_ = auVar116._24_4_ * -auVar133._24_4_;
          auVar53._28_4_ = auVar134._28_4_;
          auVar114 = vmulps_avx512vl(auVar116,ZEXT1632(auVar98));
          auVar105 = ZEXT1632(auVar98);
          auVar116 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar105);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar136,auVar136);
          auVar112 = vrsqrt14ps_avx512vl(auVar116);
          auVar116 = vmulps_avx512vl(auVar116,auVar216);
          fVar170 = auVar112._0_4_;
          fVar204 = auVar112._4_4_;
          fVar206 = auVar112._8_4_;
          fVar207 = auVar112._12_4_;
          fVar177 = auVar112._16_4_;
          fVar169 = auVar112._20_4_;
          fVar176 = auVar112._24_4_;
          auVar54._4_4_ = fVar204 * fVar204 * fVar204 * auVar116._4_4_;
          auVar54._0_4_ = fVar170 * fVar170 * fVar170 * auVar116._0_4_;
          auVar54._8_4_ = fVar206 * fVar206 * fVar206 * auVar116._8_4_;
          auVar54._12_4_ = fVar207 * fVar207 * fVar207 * auVar116._12_4_;
          auVar54._16_4_ = fVar177 * fVar177 * fVar177 * auVar116._16_4_;
          auVar54._20_4_ = fVar169 * fVar169 * fVar169 * auVar116._20_4_;
          auVar54._24_4_ = fVar176 * fVar176 * fVar176 * auVar116._24_4_;
          auVar54._28_4_ = auVar116._28_4_;
          auVar116 = vfmadd231ps_avx512vl(auVar54,auVar115,auVar112);
          auVar55._4_4_ = auVar136._4_4_ * auVar116._4_4_;
          auVar55._0_4_ = auVar136._0_4_ * auVar116._0_4_;
          auVar55._8_4_ = auVar136._8_4_ * auVar116._8_4_;
          auVar55._12_4_ = auVar136._12_4_ * auVar116._12_4_;
          auVar55._16_4_ = auVar136._16_4_ * auVar116._16_4_;
          auVar55._20_4_ = auVar136._20_4_ * auVar116._20_4_;
          auVar55._24_4_ = auVar136._24_4_ * auVar116._24_4_;
          auVar55._28_4_ = auVar112._28_4_;
          auVar56._4_4_ = auVar116._4_4_ * auVar113._4_4_;
          auVar56._0_4_ = auVar116._0_4_ * auVar113._0_4_;
          auVar56._8_4_ = auVar116._8_4_ * auVar113._8_4_;
          auVar56._12_4_ = auVar116._12_4_ * auVar113._12_4_;
          auVar56._16_4_ = auVar116._16_4_ * auVar113._16_4_;
          auVar56._20_4_ = auVar116._20_4_ * auVar113._20_4_;
          auVar56._24_4_ = auVar116._24_4_ * auVar113._24_4_;
          auVar56._28_4_ = auVar113._28_4_;
          auVar113 = vmulps_avx512vl(auVar116,auVar105);
          auVar9 = vfmadd213ps_fma(auVar52,auVar118,ZEXT1632(auVar91));
          auVar10 = vfmadd213ps_fma(auVar53,auVar118,ZEXT1632(auVar90));
          auVar115 = vfmadd213ps_avx512vl(auVar114,auVar118,auVar111);
          auVar112 = vfmadd213ps_avx512vl(auVar55,auVar119,ZEXT1632(auVar94));
          auVar214 = vfnmadd213ps_fma(auVar52,auVar118,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar56,auVar119,ZEXT1632(auVar8));
          auVar154 = vfnmadd213ps_fma(auVar53,auVar118,ZEXT1632(auVar90));
          auVar90 = vfmadd213ps_fma(auVar113,auVar119,auVar110);
          auVar96 = vfnmadd231ps_fma(auVar111,auVar118,auVar114);
          auVar93 = vfnmadd213ps_fma(auVar55,auVar119,ZEXT1632(auVar94));
          auVar95 = vfnmadd213ps_fma(auVar56,auVar119,ZEXT1632(auVar8));
          auVar97 = vfnmadd231ps_fma(auVar110,auVar119,auVar113);
          auVar110 = vsubps_avx512vl(auVar112,ZEXT1632(auVar214));
          auVar113 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar154));
          auVar116 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar96));
          auVar57._4_4_ = auVar113._4_4_ * auVar96._4_4_;
          auVar57._0_4_ = auVar113._0_4_ * auVar96._0_4_;
          auVar57._8_4_ = auVar113._8_4_ * auVar96._8_4_;
          auVar57._12_4_ = auVar113._12_4_ * auVar96._12_4_;
          auVar57._16_4_ = auVar113._16_4_ * 0.0;
          auVar57._20_4_ = auVar113._20_4_ * 0.0;
          auVar57._24_4_ = auVar113._24_4_ * 0.0;
          auVar57._28_4_ = auVar114._28_4_;
          auVar94 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar154),auVar116);
          auVar58._4_4_ = auVar116._4_4_ * auVar214._4_4_;
          auVar58._0_4_ = auVar116._0_4_ * auVar214._0_4_;
          auVar58._8_4_ = auVar116._8_4_ * auVar214._8_4_;
          auVar58._12_4_ = auVar116._12_4_ * auVar214._12_4_;
          auVar58._16_4_ = auVar116._16_4_ * 0.0;
          auVar58._20_4_ = auVar116._20_4_ * 0.0;
          auVar58._24_4_ = auVar116._24_4_ * 0.0;
          auVar58._28_4_ = auVar116._28_4_;
          auVar8 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar96),auVar110);
          auVar59._4_4_ = auVar154._4_4_ * auVar110._4_4_;
          auVar59._0_4_ = auVar154._0_4_ * auVar110._0_4_;
          auVar59._8_4_ = auVar154._8_4_ * auVar110._8_4_;
          auVar59._12_4_ = auVar154._12_4_ * auVar110._12_4_;
          auVar59._16_4_ = auVar110._16_4_ * 0.0;
          auVar59._20_4_ = auVar110._20_4_ * 0.0;
          auVar59._24_4_ = auVar110._24_4_ * 0.0;
          auVar59._28_4_ = auVar110._28_4_;
          auVar11 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar214),auVar113);
          auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar105,ZEXT1632(auVar8));
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,ZEXT1632(auVar94));
          auVar99 = ZEXT1632(auVar98);
          uVar78 = vcmpps_avx512vl(auVar113,auVar99,2);
          bVar77 = (byte)uVar78;
          fVar146 = (float)((uint)(bVar77 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar93._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar148 = (float)((uint)bVar18 * auVar9._4_4_ | (uint)!bVar18 * auVar93._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar150 = (float)((uint)bVar18 * auVar9._8_4_ | (uint)!bVar18 * auVar93._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar152 = (float)((uint)bVar18 * auVar9._12_4_ | (uint)!bVar18 * auVar93._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar146))));
          fVar147 = (float)((uint)(bVar77 & 1) * auVar10._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar95._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar149 = (float)((uint)bVar18 * auVar10._4_4_ | (uint)!bVar18 * auVar95._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar151 = (float)((uint)bVar18 * auVar10._8_4_ | (uint)!bVar18 * auVar95._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar153 = (float)((uint)bVar18 * auVar10._12_4_ | (uint)!bVar18 * auVar95._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar147))));
          auVar137._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar97._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar137._4_4_ = (float)((uint)bVar18 * auVar115._4_4_ | (uint)!bVar18 * auVar97._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar137._8_4_ = (float)((uint)bVar18 * auVar115._8_4_ | (uint)!bVar18 * auVar97._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar137._12_4_ = (float)((uint)bVar18 * auVar115._12_4_ | (uint)!bVar18 * auVar97._12_4_)
          ;
          fVar170 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar115._16_4_);
          auVar137._16_4_ = fVar170;
          fVar206 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar115._20_4_);
          auVar137._20_4_ = fVar206;
          fVar204 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar115._24_4_);
          auVar137._24_4_ = fVar204;
          iVar1 = (uint)(byte)(uVar78 >> 7) * auVar115._28_4_;
          auVar137._28_4_ = iVar1;
          auVar113 = vblendmps_avx512vl(ZEXT1632(auVar214),auVar112);
          auVar138._0_4_ =
               (uint)(bVar77 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar94._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar94._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar94._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar94._12_4_;
          auVar138._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_;
          auVar138._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_;
          auVar138._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_;
          auVar138._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar113._28_4_;
          auVar113 = vblendmps_avx512vl(ZEXT1632(auVar154),ZEXT1632(auVar91));
          auVar139._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar113._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar9._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar9._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar9._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar139._12_4_ = (float)((uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar9._12_4_);
          fVar177 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_);
          auVar139._16_4_ = fVar177;
          fVar207 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_);
          auVar139._20_4_ = fVar207;
          fVar169 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_);
          auVar139._24_4_ = fVar169;
          auVar139._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar113._28_4_;
          auVar113 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar90));
          auVar140._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar113._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar10._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar10._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar10._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar140._12_4_ = (float)((uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar10._12_4_)
          ;
          fVar176 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar113._16_4_);
          auVar140._16_4_ = fVar176;
          fVar88 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar113._20_4_);
          auVar140._20_4_ = fVar88;
          fVar89 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar113._24_4_);
          auVar140._24_4_ = fVar89;
          iVar2 = (uint)(byte)(uVar78 >> 7) * auVar113._28_4_;
          auVar140._28_4_ = iVar2;
          auVar141._0_4_ =
               (uint)(bVar77 & 1) * (int)auVar214._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar112._0_4_
          ;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar18 * (int)auVar214._4_4_ | (uint)!bVar18 * auVar112._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar18 * (int)auVar214._8_4_ | (uint)!bVar18 * auVar112._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar18 * (int)auVar214._12_4_ | (uint)!bVar18 * auVar112._12_4_;
          auVar141._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar112._16_4_;
          auVar141._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar112._20_4_;
          auVar141._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar112._24_4_;
          auVar141._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar112._28_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar78 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar112 = vsubps_avx512vl(auVar141,auVar105);
          auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar154._12_4_ |
                                                   (uint)!bVar22 * auVar91._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar154._8_4_ |
                                                            (uint)!bVar20 * auVar91._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar154._4_4_ |
                                                                     (uint)!bVar18 * auVar91._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar154._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar91._0_4_)))),auVar106);
          auVar200 = ZEXT3264(auVar116);
          auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar96._12_4_ |
                                                   (uint)!bVar23 * auVar90._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar96._8_4_ |
                                                            (uint)!bVar21 * auVar90._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar96._4_4_ |
                                                                     (uint)!bVar19 * auVar90._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar96._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar90._0_4_)))),auVar137);
          auVar114 = vsubps_avx(auVar105,auVar138);
          auVar202 = ZEXT3264(auVar114);
          auVar110 = vsubps_avx(auVar106,auVar139);
          auVar111 = vsubps_avx(auVar137,auVar140);
          auVar60._4_4_ = auVar115._4_4_ * fVar148;
          auVar60._0_4_ = auVar115._0_4_ * fVar146;
          auVar60._8_4_ = auVar115._8_4_ * fVar150;
          auVar60._12_4_ = auVar115._12_4_ * fVar152;
          auVar60._16_4_ = auVar115._16_4_ * 0.0;
          auVar60._20_4_ = auVar115._20_4_ * 0.0;
          auVar60._24_4_ = auVar115._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar60,auVar137,auVar112);
          auVar183._0_4_ = fVar147 * auVar112._0_4_;
          auVar183._4_4_ = fVar149 * auVar112._4_4_;
          auVar183._8_4_ = fVar151 * auVar112._8_4_;
          auVar183._12_4_ = fVar153 * auVar112._12_4_;
          auVar183._16_4_ = auVar112._16_4_ * 0.0;
          auVar183._20_4_ = auVar112._20_4_ * 0.0;
          auVar183._24_4_ = auVar112._24_4_ * 0.0;
          auVar183._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar183,auVar105,auVar116);
          auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar99,ZEXT1632(auVar91));
          auVar187._0_4_ = auVar116._0_4_ * auVar137._0_4_;
          auVar187._4_4_ = auVar116._4_4_ * auVar137._4_4_;
          auVar187._8_4_ = auVar116._8_4_ * auVar137._8_4_;
          auVar187._12_4_ = auVar116._12_4_ * auVar137._12_4_;
          auVar187._16_4_ = auVar116._16_4_ * fVar170;
          auVar187._20_4_ = auVar116._20_4_ * fVar206;
          auVar187._24_4_ = auVar116._24_4_ * fVar204;
          auVar187._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar187,auVar106,auVar115);
          auVar117 = vfmadd231ps_avx512vl(auVar113,auVar99,ZEXT1632(auVar91));
          auVar113 = vmulps_avx512vl(auVar111,auVar138);
          auVar113 = vfmsub231ps_avx512vl(auVar113,auVar114,auVar140);
          auVar61._4_4_ = auVar110._4_4_ * auVar140._4_4_;
          auVar61._0_4_ = auVar110._0_4_ * auVar140._0_4_;
          auVar61._8_4_ = auVar110._8_4_ * auVar140._8_4_;
          auVar61._12_4_ = auVar110._12_4_ * auVar140._12_4_;
          auVar61._16_4_ = auVar110._16_4_ * fVar176;
          auVar61._20_4_ = auVar110._20_4_ * fVar88;
          auVar61._24_4_ = auVar110._24_4_ * fVar89;
          auVar61._28_4_ = iVar2;
          auVar91 = vfmsub231ps_fma(auVar61,auVar139,auVar111);
          auVar188._0_4_ = auVar139._0_4_ * auVar114._0_4_;
          auVar188._4_4_ = auVar139._4_4_ * auVar114._4_4_;
          auVar188._8_4_ = auVar139._8_4_ * auVar114._8_4_;
          auVar188._12_4_ = auVar139._12_4_ * auVar114._12_4_;
          auVar188._16_4_ = fVar177 * auVar114._16_4_;
          auVar188._20_4_ = fVar207 * auVar114._20_4_;
          auVar188._24_4_ = fVar169 * auVar114._24_4_;
          auVar188._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar188,auVar110,auVar138);
          auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar99,auVar113);
          auVar120 = vfmadd231ps_avx512vl(auVar113,auVar99,ZEXT1632(auVar91));
          auVar191 = ZEXT3264(auVar120);
          auVar113 = vmaxps_avx(auVar117,auVar120);
          uVar167 = vcmpps_avx512vl(auVar113,auVar99,2);
          bVar86 = bVar86 & (byte)uVar167;
          if (bVar86 != 0) {
            auVar62._4_4_ = auVar111._4_4_ * auVar116._4_4_;
            auVar62._0_4_ = auVar111._0_4_ * auVar116._0_4_;
            auVar62._8_4_ = auVar111._8_4_ * auVar116._8_4_;
            auVar62._12_4_ = auVar111._12_4_ * auVar116._12_4_;
            auVar62._16_4_ = auVar111._16_4_ * auVar116._16_4_;
            auVar62._20_4_ = auVar111._20_4_ * auVar116._20_4_;
            auVar62._24_4_ = auVar111._24_4_ * auVar116._24_4_;
            auVar62._28_4_ = auVar113._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,auVar110,auVar115);
            auVar63._4_4_ = auVar115._4_4_ * auVar114._4_4_;
            auVar63._0_4_ = auVar115._0_4_ * auVar114._0_4_;
            auVar63._8_4_ = auVar115._8_4_ * auVar114._8_4_;
            auVar63._12_4_ = auVar115._12_4_ * auVar114._12_4_;
            auVar63._16_4_ = auVar115._16_4_ * auVar114._16_4_;
            auVar63._20_4_ = auVar115._20_4_ * auVar114._20_4_;
            auVar63._24_4_ = auVar115._24_4_ * auVar114._24_4_;
            auVar63._28_4_ = auVar115._28_4_;
            auVar94 = vfmsub231ps_fma(auVar63,auVar112,auVar111);
            auVar64._4_4_ = auVar110._4_4_ * auVar112._4_4_;
            auVar64._0_4_ = auVar110._0_4_ * auVar112._0_4_;
            auVar64._8_4_ = auVar110._8_4_ * auVar112._8_4_;
            auVar64._12_4_ = auVar110._12_4_ * auVar112._12_4_;
            auVar64._16_4_ = auVar110._16_4_ * auVar112._16_4_;
            auVar64._20_4_ = auVar110._20_4_ * auVar112._20_4_;
            auVar64._24_4_ = auVar110._24_4_ * auVar112._24_4_;
            auVar64._28_4_ = auVar110._28_4_;
            auVar9 = vfmsub231ps_fma(auVar64,auVar114,auVar116);
            auVar91 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar9));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar113 = vrcp14ps_avx512vl(ZEXT1632(auVar90));
            auVar115 = auVar217._0_32_;
            auVar116 = vfnmadd213ps_avx512vl(auVar113,ZEXT1632(auVar90),auVar115);
            auVar91 = vfmadd132ps_fma(auVar116,auVar113,auVar113);
            auVar200 = ZEXT1664(auVar91);
            auVar65._4_4_ = auVar9._4_4_ * auVar137._4_4_;
            auVar65._0_4_ = auVar9._0_4_ * auVar137._0_4_;
            auVar65._8_4_ = auVar9._8_4_ * auVar137._8_4_;
            auVar65._12_4_ = auVar9._12_4_ * auVar137._12_4_;
            auVar65._16_4_ = fVar170 * 0.0;
            auVar65._20_4_ = fVar206 * 0.0;
            auVar65._24_4_ = fVar204 * 0.0;
            auVar65._28_4_ = iVar1;
            auVar94 = vfmadd231ps_fma(auVar65,auVar106,ZEXT1632(auVar94));
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar105,ZEXT1632(auVar8));
            fVar170 = auVar91._0_4_;
            fVar204 = auVar91._4_4_;
            fVar206 = auVar91._8_4_;
            fVar207 = auVar91._12_4_;
            local_3e0._28_4_ = auVar113._28_4_;
            local_3e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar94._12_4_ * fVar207,
                                    CONCAT48(auVar94._8_4_ * fVar206,
                                             CONCAT44(auVar94._4_4_ * fVar204,
                                                      auVar94._0_4_ * fVar170))));
            auVar202 = ZEXT3264(local_3e0);
            auVar75._4_4_ = uStack_55c;
            auVar75._0_4_ = local_560;
            auVar75._8_4_ = uStack_558;
            auVar75._12_4_ = uStack_554;
            auVar75._16_4_ = uStack_550;
            auVar75._20_4_ = uStack_54c;
            auVar75._24_4_ = uStack_548;
            auVar75._28_4_ = uStack_544;
            uVar167 = vcmpps_avx512vl(local_3e0,auVar75,0xd);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar32._4_4_ = uVar166;
            auVar32._0_4_ = uVar166;
            auVar32._8_4_ = uVar166;
            auVar32._12_4_ = uVar166;
            auVar32._16_4_ = uVar166;
            auVar32._20_4_ = uVar166;
            auVar32._24_4_ = uVar166;
            auVar32._28_4_ = uVar166;
            uVar26 = vcmpps_avx512vl(local_3e0,auVar32,2);
            bVar86 = (byte)uVar167 & (byte)uVar26 & bVar86;
            if (bVar86 != 0) {
              uVar87 = vcmpps_avx512vl(ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar87 = bVar86 & uVar87;
              if ((char)uVar87 != '\0') {
                fVar177 = auVar117._0_4_ * fVar170;
                fVar169 = auVar117._4_4_ * fVar204;
                auVar66._4_4_ = fVar169;
                auVar66._0_4_ = fVar177;
                fVar176 = auVar117._8_4_ * fVar206;
                auVar66._8_4_ = fVar176;
                fVar88 = auVar117._12_4_ * fVar207;
                auVar66._12_4_ = fVar88;
                fVar89 = auVar117._16_4_ * 0.0;
                auVar66._16_4_ = fVar89;
                fVar146 = auVar117._20_4_ * 0.0;
                auVar66._20_4_ = fVar146;
                fVar147 = auVar117._24_4_ * 0.0;
                auVar66._24_4_ = fVar147;
                auVar66._28_4_ = auVar117._28_4_;
                auVar113 = vsubps_avx512vl(auVar115,auVar66);
                local_420._0_4_ =
                     (float)((uint)(bVar77 & 1) * (int)fVar177 |
                            (uint)!(bool)(bVar77 & 1) * auVar113._0_4_);
                bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
                local_420._4_4_ =
                     (float)((uint)bVar18 * (int)fVar169 | (uint)!bVar18 * auVar113._4_4_);
                bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                local_420._8_4_ =
                     (float)((uint)bVar18 * (int)fVar176 | (uint)!bVar18 * auVar113._8_4_);
                bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                local_420._12_4_ =
                     (float)((uint)bVar18 * (int)fVar88 | (uint)!bVar18 * auVar113._12_4_);
                bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                local_420._16_4_ =
                     (float)((uint)bVar18 * (int)fVar89 | (uint)!bVar18 * auVar113._16_4_);
                bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                local_420._20_4_ =
                     (float)((uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar113._20_4_);
                bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                local_420._24_4_ =
                     (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar113._24_4_);
                bVar18 = SUB81(uVar78 >> 7,0);
                local_420._28_4_ =
                     (float)((uint)bVar18 * auVar117._28_4_ | (uint)!bVar18 * auVar113._28_4_);
                auVar113 = vsubps_avx(auVar119,auVar118);
                auVar91 = vfmadd213ps_fma(auVar113,local_420,auVar118);
                uVar166 = *(undefined4 *)((long)local_608->ray_space + k * 4 + -0x20);
                auVar33._4_4_ = uVar166;
                auVar33._0_4_ = uVar166;
                auVar33._8_4_ = uVar166;
                auVar33._12_4_ = uVar166;
                auVar33._16_4_ = uVar166;
                auVar33._20_4_ = uVar166;
                auVar33._24_4_ = uVar166;
                auVar33._28_4_ = uVar166;
                auVar113 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar91._12_4_ + auVar91._12_4_,
                                                              CONCAT48(auVar91._8_4_ + auVar91._8_4_
                                                                       ,CONCAT44(auVar91._4_4_ +
                                                                                 auVar91._4_4_,
                                                                                 auVar91._0_4_ +
                                                                                 auVar91._0_4_)))),
                                           auVar33);
                uVar25 = vcmpps_avx512vl(local_3e0,auVar113,6);
                uVar87 = uVar87 & uVar25;
                bVar86 = (byte)uVar87;
                if (bVar86 != 0) {
                  auVar168._0_4_ = auVar120._0_4_ * fVar170;
                  auVar168._4_4_ = auVar120._4_4_ * fVar204;
                  auVar168._8_4_ = auVar120._8_4_ * fVar206;
                  auVar168._12_4_ = auVar120._12_4_ * fVar207;
                  auVar168._16_4_ = auVar120._16_4_ * 0.0;
                  auVar168._20_4_ = auVar120._20_4_ * 0.0;
                  auVar168._24_4_ = auVar120._24_4_ * 0.0;
                  auVar168._28_4_ = 0;
                  auVar113 = vsubps_avx512vl(auVar115,auVar168);
                  auVar142._0_4_ =
                       (uint)(bVar77 & 1) * (int)auVar168._0_4_ |
                       (uint)!(bool)(bVar77 & 1) * auVar113._0_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
                  auVar142._4_4_ =
                       (uint)bVar18 * (int)auVar168._4_4_ | (uint)!bVar18 * auVar113._4_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                  auVar142._8_4_ =
                       (uint)bVar18 * (int)auVar168._8_4_ | (uint)!bVar18 * auVar113._8_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                  auVar142._12_4_ =
                       (uint)bVar18 * (int)auVar168._12_4_ | (uint)!bVar18 * auVar113._12_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                  auVar142._16_4_ =
                       (uint)bVar18 * (int)auVar168._16_4_ | (uint)!bVar18 * auVar113._16_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                  auVar142._20_4_ =
                       (uint)bVar18 * (int)auVar168._20_4_ | (uint)!bVar18 * auVar113._20_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                  auVar142._24_4_ =
                       (uint)bVar18 * (int)auVar168._24_4_ | (uint)!bVar18 * auVar113._24_4_;
                  auVar142._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar113._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_400 = vfmsub132ps_avx512vl(auVar142,auVar115,auVar34);
                  local_3c0 = (undefined4)lVar81;
                  local_3b0 = local_670;
                  uStack_3a8 = uStack_668;
                  local_3a0 = local_680;
                  uStack_398 = uStack_678;
                  local_390 = local_690;
                  uStack_388 = uStack_688;
                  local_380 = local_6a0;
                  uStack_378 = uStack_698;
                  pGVar83 = (context->scene->geometries).items[uVar12].ptr;
                  if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    uVar85 = (uint)uVar87;
                    auVar91 = vcvtsi2ss_avx512f(auVar98,local_3c0);
                    fVar170 = auVar91._0_4_;
                    local_360[0] = (fVar170 + local_420._0_4_ + 0.0) * local_100;
                    local_360[1] = (fVar170 + local_420._4_4_ + 1.0) * fStack_fc;
                    local_360[2] = (fVar170 + local_420._8_4_ + 2.0) * fStack_f8;
                    local_360[3] = (fVar170 + local_420._12_4_ + 3.0) * fStack_f4;
                    fStack_350 = (fVar170 + local_420._16_4_ + 4.0) * fStack_f0;
                    fStack_34c = (fVar170 + local_420._20_4_ + 5.0) * fStack_ec;
                    fStack_348 = (fVar170 + local_420._24_4_ + 6.0) * fStack_e8;
                    fStack_344 = fVar170 + local_420._28_4_ + 7.0;
                    local_340 = local_400;
                    local_320 = local_3e0;
                    auVar161._8_4_ = 0x7f800000;
                    auVar161._0_8_ = 0x7f8000007f800000;
                    auVar161._12_4_ = 0x7f800000;
                    auVar161._16_4_ = 0x7f800000;
                    auVar161._20_4_ = 0x7f800000;
                    auVar161._24_4_ = 0x7f800000;
                    auVar161._28_4_ = 0x7f800000;
                    auVar113 = vblendmps_avx512vl(auVar161,local_3e0);
                    auVar143._0_4_ =
                         (uint)(bVar86 & 1) * auVar113._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar143._4_4_ = (uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar143._8_4_ = (uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar143._12_4_ = (uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar143._16_4_ = (uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar143._20_4_ = (uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar143._24_4_ = (uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = SUB81(uVar87 >> 7,0);
                    auVar143._28_4_ = (uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar113 = vshufps_avx(auVar143,auVar143,0xb1);
                    auVar113 = vminps_avx(auVar143,auVar113);
                    auVar116 = vshufpd_avx(auVar113,auVar113,5);
                    auVar113 = vminps_avx(auVar113,auVar116);
                    auVar116 = vpermpd_avx2(auVar113,0x4e);
                    auVar113 = vminps_avx(auVar113,auVar116);
                    uVar167 = vcmpps_avx512vl(auVar143,auVar113,0);
                    if ((bVar86 & (byte)uVar167) != 0) {
                      uVar85 = (uint)(bVar86 & (byte)uVar167);
                    }
                    uVar79 = 0;
                    for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                      uVar79 = uVar79 + 1;
                    }
                    uVar78 = (ulong)uVar79;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_630 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_618 = pGVar83;
                      local_5d8 = uVar80;
                      local_5c0 = local_3e0;
                      local_3bc = iVar13;
                      do {
                        local_1c0 = local_360[uVar78];
                        local_1a0 = *(undefined4 *)(local_340 + uVar78 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_320 + uVar78 * 4);
                        local_660.context = context->user;
                        fVar204 = 1.0 - local_1c0;
                        fVar170 = fVar204 * fVar204 * -3.0;
                        auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * fVar204)),
                                                  ZEXT416((uint)(local_1c0 * fVar204)),
                                                  ZEXT416(0xc0000000));
                        auVar90 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar204)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar204 = auVar91._0_4_ * 3.0;
                        fVar206 = auVar90._0_4_ * 3.0;
                        fVar207 = local_1c0 * local_1c0 * 3.0;
                        auVar194._0_4_ = fVar207 * fVar67;
                        auVar194._4_4_ = fVar207 * fVar68;
                        auVar194._8_4_ = fVar207 * fVar69;
                        auVar194._12_4_ = fVar207 * fVar76;
                        auVar155._4_4_ = fVar206;
                        auVar155._0_4_ = fVar206;
                        auVar155._8_4_ = fVar206;
                        auVar155._12_4_ = fVar206;
                        auVar91 = vfmadd132ps_fma(auVar155,auVar194,auVar92);
                        auVar181._4_4_ = fVar204;
                        auVar181._0_4_ = fVar204;
                        auVar181._8_4_ = fVar204;
                        auVar181._12_4_ = fVar204;
                        auVar91 = vfmadd132ps_fma(auVar181,auVar91,auVar7);
                        auVar156._4_4_ = fVar170;
                        auVar156._0_4_ = fVar170;
                        auVar156._8_4_ = fVar170;
                        auVar156._12_4_ = fVar170;
                        auVar91 = vfmadd132ps_fma(auVar156,auVar91,auVar6);
                        local_220 = auVar91._0_4_;
                        auVar189._8_4_ = 1;
                        auVar189._0_8_ = 0x100000001;
                        auVar189._12_4_ = 1;
                        auVar189._16_4_ = 1;
                        auVar189._20_4_ = 1;
                        auVar189._24_4_ = 1;
                        auVar189._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar189,ZEXT1632(auVar91));
                        auVar191 = ZEXT3264(local_200);
                        auVar195._8_4_ = 2;
                        auVar195._0_8_ = 0x200000002;
                        auVar195._12_4_ = 2;
                        auVar198._16_4_ = 2;
                        auVar198._0_16_ = auVar195;
                        auVar198._20_4_ = 2;
                        auVar198._24_4_ = 2;
                        auVar198._28_4_ = 2;
                        auVar200 = ZEXT3264(auVar198);
                        local_1e0 = vpermps_avx2(auVar198,ZEXT1632(auVar91));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_2e0._0_8_;
                        uStack_178 = local_2e0._8_8_;
                        uStack_170 = local_2e0._16_8_;
                        uStack_168 = local_2e0._24_8_;
                        local_160 = local_2c0;
                        auVar113 = vpcmpeqd_avx2(local_2c0,local_2c0);
                        local_610[1] = auVar113;
                        *local_610 = auVar113;
                        local_140 = (local_660.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_660.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_600 = local_300;
                        local_660.valid = (int *)local_600;
                        local_660.geometryUserPtr = pGVar83->userPtr;
                        local_660.hit = (RTCHitN *)&local_220;
                        local_660.N = 8;
                        local_660.ray = (RTCRayN *)ray;
                        if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar191 = ZEXT1664(local_200._0_16_);
                          auVar200 = ZEXT1664(auVar195);
                          (*pGVar83->intersectionFilterN)(&local_660);
                          auVar202 = ZEXT3264(local_5c0);
                          pGVar83 = local_618;
                        }
                        if (local_600 == (undefined1  [32])0x0) {
LAB_01b07c87:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_630._0_4_;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar191 = ZEXT1664(auVar191._0_16_);
                            auVar200 = ZEXT1664(auVar200._0_16_);
                            (*p_Var17)(&local_660);
                            auVar202 = ZEXT3264(local_5c0);
                            pGVar83 = local_618;
                          }
                          if (local_600 == (undefined1  [32])0x0) goto LAB_01b07c87;
                          uVar80 = vptestmd_avx512vl(local_600,local_600);
                          iVar1 = *(int *)(local_660.hit + 4);
                          iVar2 = *(int *)(local_660.hit + 8);
                          iVar70 = *(int *)(local_660.hit + 0xc);
                          iVar71 = *(int *)(local_660.hit + 0x10);
                          iVar72 = *(int *)(local_660.hit + 0x14);
                          iVar73 = *(int *)(local_660.hit + 0x18);
                          iVar74 = *(int *)(local_660.hit + 0x1c);
                          bVar86 = (byte)uVar80;
                          bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar80 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar80 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar80 >> 6) & 1);
                          bVar24 = SUB81(uVar80 >> 7,0);
                          *(uint *)(local_660.ray + 0x180) =
                               (uint)(bVar86 & 1) * *(int *)local_660.hit |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x180);
                          *(uint *)(local_660.ray + 0x184) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x184);
                          *(uint *)(local_660.ray + 0x188) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x188);
                          *(uint *)(local_660.ray + 0x18c) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x18c);
                          *(uint *)(local_660.ray + 400) =
                               (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_660.ray + 400)
                          ;
                          *(uint *)(local_660.ray + 0x194) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x194);
                          *(uint *)(local_660.ray + 0x198) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x198);
                          *(uint *)(local_660.ray + 0x19c) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x19c);
                          iVar1 = *(int *)(local_660.hit + 0x24);
                          iVar2 = *(int *)(local_660.hit + 0x28);
                          iVar70 = *(int *)(local_660.hit + 0x2c);
                          iVar71 = *(int *)(local_660.hit + 0x30);
                          iVar72 = *(int *)(local_660.hit + 0x34);
                          iVar73 = *(int *)(local_660.hit + 0x38);
                          iVar74 = *(int *)(local_660.hit + 0x3c);
                          bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar80 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar80 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar80 >> 6) & 1);
                          bVar24 = SUB81(uVar80 >> 7,0);
                          *(uint *)(local_660.ray + 0x1a0) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x20) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1a0);
                          *(uint *)(local_660.ray + 0x1a4) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1a4);
                          *(uint *)(local_660.ray + 0x1a8) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1a8);
                          *(uint *)(local_660.ray + 0x1ac) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1ac);
                          *(uint *)(local_660.ray + 0x1b0) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x1b0);
                          *(uint *)(local_660.ray + 0x1b4) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x1b4);
                          *(uint *)(local_660.ray + 0x1b8) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x1b8);
                          *(uint *)(local_660.ray + 0x1bc) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x1bc);
                          iVar1 = *(int *)(local_660.hit + 0x44);
                          iVar2 = *(int *)(local_660.hit + 0x48);
                          iVar70 = *(int *)(local_660.hit + 0x4c);
                          iVar71 = *(int *)(local_660.hit + 0x50);
                          iVar72 = *(int *)(local_660.hit + 0x54);
                          iVar73 = *(int *)(local_660.hit + 0x58);
                          iVar74 = *(int *)(local_660.hit + 0x5c);
                          bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar80 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar80 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar80 >> 6) & 1);
                          bVar24 = SUB81(uVar80 >> 7,0);
                          *(uint *)(local_660.ray + 0x1c0) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x40) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1c0);
                          *(uint *)(local_660.ray + 0x1c4) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1c4);
                          *(uint *)(local_660.ray + 0x1c8) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1c8);
                          *(uint *)(local_660.ray + 0x1cc) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1cc);
                          *(uint *)(local_660.ray + 0x1d0) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x1d0);
                          *(uint *)(local_660.ray + 0x1d4) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x1d4);
                          *(uint *)(local_660.ray + 0x1d8) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x1d8);
                          *(uint *)(local_660.ray + 0x1dc) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x1dc);
                          iVar1 = *(int *)(local_660.hit + 100);
                          iVar2 = *(int *)(local_660.hit + 0x68);
                          iVar70 = *(int *)(local_660.hit + 0x6c);
                          iVar71 = *(int *)(local_660.hit + 0x70);
                          iVar72 = *(int *)(local_660.hit + 0x74);
                          iVar73 = *(int *)(local_660.hit + 0x78);
                          iVar74 = *(int *)(local_660.hit + 0x7c);
                          bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar80 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar80 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar80 >> 6) & 1);
                          bVar24 = SUB81(uVar80 >> 7,0);
                          *(uint *)(local_660.ray + 0x1e0) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x60) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x1e0);
                          *(uint *)(local_660.ray + 0x1e4) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1e4);
                          *(uint *)(local_660.ray + 0x1e8) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1e8);
                          *(uint *)(local_660.ray + 0x1ec) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x1ec);
                          *(uint *)(local_660.ray + 0x1f0) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x1f0);
                          *(uint *)(local_660.ray + 500) =
                               (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_660.ray + 500)
                          ;
                          *(uint *)(local_660.ray + 0x1f8) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x1f8);
                          *(uint *)(local_660.ray + 0x1fc) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x1fc);
                          iVar1 = *(int *)(local_660.hit + 0x84);
                          iVar2 = *(int *)(local_660.hit + 0x88);
                          iVar70 = *(int *)(local_660.hit + 0x8c);
                          iVar71 = *(int *)(local_660.hit + 0x90);
                          iVar72 = *(int *)(local_660.hit + 0x94);
                          iVar73 = *(int *)(local_660.hit + 0x98);
                          iVar74 = *(int *)(local_660.hit + 0x9c);
                          bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar80 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar80 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar80 >> 6) & 1);
                          bVar24 = SUB81(uVar80 >> 7,0);
                          *(uint *)(local_660.ray + 0x200) =
                               (uint)(bVar86 & 1) * *(int *)(local_660.hit + 0x80) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_660.ray + 0x200);
                          *(uint *)(local_660.ray + 0x204) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x204);
                          *(uint *)(local_660.ray + 0x208) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x208);
                          *(uint *)(local_660.ray + 0x20c) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_660.ray + 0x20c);
                          *(uint *)(local_660.ray + 0x210) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_660.ray + 0x210);
                          *(uint *)(local_660.ray + 0x214) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_660.ray + 0x214);
                          *(uint *)(local_660.ray + 0x218) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_660.ray + 0x218);
                          *(uint *)(local_660.ray + 0x21c) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_660.ray + 0x21c);
                          auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar113;
                          auVar113 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar113;
                          auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar113;
                          auVar113 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_660.hit + 0x100));
                          *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar113;
                          local_630._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_630._4_4_ = 0;
                          local_630._8_4_ = 0;
                          local_630._12_4_ = 0;
                        }
                        bVar86 = ~(byte)(1 << ((uint)uVar78 & 0x1f)) & (byte)uVar87;
                        auVar162._4_4_ = local_630._0_4_;
                        auVar162._0_4_ = local_630._0_4_;
                        auVar162._8_4_ = local_630._0_4_;
                        auVar162._12_4_ = local_630._0_4_;
                        auVar162._16_4_ = local_630._0_4_;
                        auVar162._20_4_ = local_630._0_4_;
                        auVar162._24_4_ = local_630._0_4_;
                        auVar162._28_4_ = local_630._0_4_;
                        uVar167 = vcmpps_avx512vl(auVar202._0_32_,auVar162,2);
                        if ((bVar86 & (byte)uVar167) == 0) goto LAB_01b07d26;
                        bVar86 = bVar86 & (byte)uVar167;
                        uVar85 = (uint)bVar86;
                        uVar87 = (ulong)uVar85;
                        auVar163._8_4_ = 0x7f800000;
                        auVar163._0_8_ = 0x7f8000007f800000;
                        auVar163._12_4_ = 0x7f800000;
                        auVar163._16_4_ = 0x7f800000;
                        auVar163._20_4_ = 0x7f800000;
                        auVar163._24_4_ = 0x7f800000;
                        auVar163._28_4_ = 0x7f800000;
                        auVar113 = vblendmps_avx512vl(auVar163,auVar202._0_32_);
                        auVar144._0_4_ =
                             (uint)(bVar86 & 1) * auVar113._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 1 & 1);
                        auVar144._4_4_ = (uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 2 & 1);
                        auVar144._8_4_ = (uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 3 & 1);
                        auVar144._12_4_ =
                             (uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 4 & 1);
                        auVar144._16_4_ =
                             (uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 5 & 1);
                        auVar144._20_4_ =
                             (uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar86 >> 6 & 1);
                        auVar144._24_4_ =
                             (uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar144._28_4_ =
                             (uint)(bVar86 >> 7) * auVar113._28_4_ |
                             (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                        auVar113 = vshufps_avx(auVar144,auVar144,0xb1);
                        auVar113 = vminps_avx(auVar144,auVar113);
                        auVar116 = vshufpd_avx(auVar113,auVar113,5);
                        auVar113 = vminps_avx(auVar113,auVar116);
                        auVar116 = vpermpd_avx2(auVar113,0x4e);
                        auVar113 = vminps_avx(auVar113,auVar116);
                        uVar167 = vcmpps_avx512vl(auVar144,auVar113,0);
                        bVar86 = (byte)uVar167 & bVar86;
                        if (bVar86 != 0) {
                          uVar85 = (uint)bVar86;
                        }
                        uVar79 = 0;
                        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                          uVar79 = uVar79 + 1;
                        }
                        uVar78 = (ulong)uVar79;
                      } while( true );
                    }
                    fVar170 = local_360[uVar78];
                    uVar166 = *(undefined4 *)(local_340 + uVar78 * 4);
                    fVar206 = 1.0 - fVar170;
                    fVar204 = fVar206 * fVar206 * -3.0;
                    auVar191 = ZEXT464((uint)fVar204);
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),
                                              ZEXT416((uint)(fVar170 * fVar206)),ZEXT416(0xc0000000)
                                             );
                    auVar90 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar206)),
                                              ZEXT416((uint)(fVar170 * fVar170)),ZEXT416(0x40000000)
                                             );
                    fVar206 = auVar91._0_4_ * 3.0;
                    fVar207 = auVar90._0_4_ * 3.0;
                    fVar177 = fVar170 * fVar170 * 3.0;
                    auVar193._0_4_ = fVar177 * fVar67;
                    auVar193._4_4_ = fVar177 * fVar68;
                    auVar193._8_4_ = fVar177 * fVar69;
                    auVar193._12_4_ = fVar177 * fVar76;
                    auVar200 = ZEXT1664(auVar193);
                    auVar173._4_4_ = fVar207;
                    auVar173._0_4_ = fVar207;
                    auVar173._8_4_ = fVar207;
                    auVar173._12_4_ = fVar207;
                    auVar91 = vfmadd132ps_fma(auVar173,auVar193,auVar92);
                    auVar180._4_4_ = fVar206;
                    auVar180._0_4_ = fVar206;
                    auVar180._8_4_ = fVar206;
                    auVar180._12_4_ = fVar206;
                    auVar91 = vfmadd132ps_fma(auVar180,auVar91,auVar7);
                    auVar174._4_4_ = fVar204;
                    auVar174._0_4_ = fVar204;
                    auVar174._8_4_ = fVar204;
                    auVar174._12_4_ = fVar204;
                    auVar91 = vfmadd132ps_fma(auVar174,auVar91,auVar6);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar78 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar91._0_4_;
                    uVar14 = vextractps_avx(auVar91,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar14;
                    uVar14 = vextractps_avx(auVar91,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar14;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar170;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar166;
                    *(int *)(ray + k * 4 + 0x220) = (int)uVar80;
                    *(uint *)(ray + k * 4 + 0x240) = uVar12;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b07975;
      }
    }
    uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar31._4_4_ = uVar166;
    auVar31._0_4_ = uVar166;
    auVar31._8_4_ = uVar166;
    auVar31._12_4_ = uVar166;
    auVar31._16_4_ = uVar166;
    auVar31._20_4_ = uVar166;
    auVar31._24_4_ = uVar166;
    auVar31._28_4_ = uVar166;
    uVar167 = vcmpps_avx512vl(auVar218._0_32_,auVar31,2);
    local_5c8 = (ulong)((uint)local_5c8 & (uint)local_5c8 + 0xff & (uint)uVar167);
  } while( true );
LAB_01b07d26:
  auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar217 = ZEXT3264(auVar113);
  auVar218 = ZEXT3264(local_540);
  auVar219 = ZEXT464(0xbf800000);
  uVar80 = local_5d8;
LAB_01b07975:
  lVar81 = lVar81 + 8;
  goto LAB_01b070dc;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }